

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.t.cpp
# Opt level: O2

void relop<int,int,int>(env *lest_env)

{
  ostream *poVar1;
  uint uVar2;
  int iVar3;
  failure *pfVar4;
  uint uVar5;
  int iVar6;
  bool bVar7;
  allocator local_4d62;
  allocator local_4d61;
  ctx lest__ctx_section;
  result score;
  optional<int> local_4d18 [4];
  string local_4cf8 [32];
  text local_4cd8;
  location local_4cb8;
  optional<int> e1;
  optional<int> d;
  optional<int> e2;
  message local_4c78;
  ctx lest__ctx_setup;
  text local_4bf0;
  text local_4bd0;
  text local_4bb0;
  text local_4b90;
  text local_4b70;
  text local_4b50;
  text local_4b30;
  text local_4b10;
  text local_4af0;
  text local_4ad0;
  text local_4ab0;
  text local_4a90;
  text local_4a70;
  text local_4a50;
  text local_4a30;
  text local_4a10;
  text local_49f0;
  text local_49d0;
  text local_49b0;
  text local_4990;
  text local_4970;
  text local_4950;
  text local_4930;
  text local_4910;
  text local_48f0;
  text local_48d0;
  text local_48b0;
  text local_4890;
  text local_4870;
  text local_4850;
  text local_4830;
  text local_4810;
  text local_47f0;
  text local_47d0;
  text local_47b0;
  text local_4790;
  text local_4770;
  text local_4750;
  text local_4730;
  text local_4710;
  text local_46f0;
  text local_46d0;
  text local_46b0;
  text local_4690 [2];
  location local_4648 [2];
  location local_45f8 [2];
  location local_45a8 [2];
  location local_4558 [2];
  location local_4508 [2];
  location local_44b8 [2];
  location local_4468 [2];
  location local_4418 [2];
  location local_43c8 [2];
  location local_4378 [2];
  location local_4328 [2];
  location local_42d8 [2];
  location local_4288 [2];
  location local_4238 [2];
  location local_41e8 [2];
  location local_4198 [2];
  location local_4148 [2];
  location local_40f8 [2];
  location local_40a8 [2];
  location local_4058 [2];
  location local_4008 [2];
  location local_3fb8 [2];
  location local_3f68 [2];
  location local_3f18 [2];
  location local_3ec8 [2];
  location local_3e78 [2];
  location local_3e28 [2];
  location local_3dd8 [2];
  location local_3d88 [2];
  location local_3d38 [2];
  location local_3ce8 [2];
  location local_3c98 [2];
  location local_3c48 [2];
  location local_3bf8 [2];
  location local_3ba8 [2];
  location local_3b58 [2];
  location local_3b08 [2];
  location local_3ab8 [2];
  location local_3a68 [2];
  location local_3a18 [2];
  location local_39c8 [2];
  location local_3978 [2];
  location local_3928 [2];
  location local_38d8;
  text local_3890;
  string local_3870 [32];
  text local_3850 [2];
  text local_3810;
  string local_37f0 [32];
  text local_37d0 [2];
  text local_3790;
  string local_3770 [32];
  text local_3750 [2];
  text local_3710;
  string local_36f0 [32];
  text local_36d0 [2];
  text local_3690;
  string local_3670 [32];
  text local_3650 [2];
  text local_3610;
  string local_35f0 [32];
  text local_35d0 [2];
  text local_3590;
  string local_3570 [32];
  text local_3550 [2];
  text local_3510;
  string local_34f0 [32];
  text local_34d0 [2];
  text local_3490;
  string local_3470 [32];
  text local_3450 [2];
  text local_3410;
  string local_33f0 [32];
  text local_33d0 [2];
  text local_3390;
  string local_3370 [32];
  text local_3350 [2];
  text local_3310;
  string local_32f0 [32];
  text local_32d0 [2];
  text local_3290;
  string local_3270 [32];
  text local_3250 [2];
  text local_3210;
  string local_31f0 [32];
  text local_31d0 [2];
  text local_3190;
  string local_3170 [32];
  text local_3150 [2];
  text local_3110;
  string local_30f0 [32];
  text local_30d0 [2];
  text local_3090;
  string local_3070 [32];
  text local_3050 [2];
  text local_3010;
  string local_2ff0 [32];
  text local_2fd0 [2];
  text local_2f90;
  string local_2f70 [32];
  text local_2f50 [2];
  text local_2f10;
  string local_2ef0 [32];
  text local_2ed0 [2];
  text local_2e90;
  string local_2e70 [32];
  text local_2e50 [2];
  text local_2e10;
  string local_2df0 [32];
  text local_2dd0 [2];
  text local_2d90;
  string local_2d70 [32];
  text local_2d50 [2];
  text local_2d10;
  string local_2cf0 [32];
  text local_2cd0 [2];
  text local_2c90;
  string local_2c70 [32];
  text local_2c50 [2];
  text local_2c10;
  string local_2bf0 [32];
  text local_2bd0 [2];
  text local_2b90;
  string local_2b70 [32];
  text local_2b50 [2];
  text local_2b10;
  string local_2af0 [32];
  text local_2ad0 [2];
  text local_2a90;
  string local_2a70 [32];
  text local_2a50 [2];
  text local_2a10;
  string local_29f0 [32];
  text local_29d0 [2];
  text local_2990;
  string local_2970 [32];
  text local_2950 [2];
  text local_2910;
  string local_28f0 [32];
  text local_28d0 [2];
  text local_2890;
  string local_2870 [32];
  text local_2850 [2];
  text local_2810;
  string local_27f0 [32];
  text local_27d0 [2];
  text local_2790;
  string local_2770 [32];
  text local_2750 [2];
  text local_2710;
  string local_26f0 [32];
  text local_26d0 [2];
  text local_2690;
  string local_2670 [32];
  text local_2650 [2];
  text local_2610;
  string local_25f0 [32];
  text local_25d0 [2];
  text local_2590;
  string local_2570 [32];
  text local_2550 [2];
  text local_2510;
  string local_24f0 [32];
  text local_24d0 [2];
  text local_2490;
  string local_2470 [32];
  text local_2450 [2];
  text local_2410;
  string local_23f0 [32];
  text local_23d0 [2];
  text local_2390;
  string local_2370 [32];
  text local_2350 [2];
  text local_2310;
  string local_22f0 [32];
  text local_22d0;
  location local_22b0;
  location local_2288;
  location local_2260;
  location local_2238;
  location local_2210;
  location local_21e8;
  location local_21c0;
  location local_2198;
  location local_2170;
  location local_2148;
  location local_2120;
  location local_20f8;
  location local_20d0;
  location local_20a8;
  location local_2080;
  location local_2058;
  location local_2030;
  location local_2008;
  location local_1fe0;
  location local_1fb8;
  location local_1f90;
  location local_1f68;
  location local_1f40;
  location local_1f18;
  location local_1ef0;
  location local_1ec8;
  location local_1ea0;
  location local_1e78;
  location local_1e50;
  location local_1e28;
  location local_1e00;
  location local_1dd8;
  location local_1db0;
  location local_1d88;
  location local_1d60;
  location local_1d38;
  location local_1d10;
  location local_1ce8;
  location local_1cc0;
  location local_1c98;
  location local_1c70;
  location local_1c48;
  location local_1c20;
  location local_1bf8;
  text local_1bb0;
  string local_1b90 [32];
  text local_1b70 [2];
  text local_1b30;
  string local_1b10 [32];
  text local_1af0 [2];
  text local_1ab0;
  string local_1a90 [32];
  text local_1a70 [2];
  text local_1a30;
  string local_1a10 [32];
  text local_19f0 [2];
  text local_19b0;
  string local_1990 [32];
  text local_1970 [2];
  text local_1930;
  string local_1910 [32];
  text local_18f0 [2];
  text local_18b0;
  string local_1890 [32];
  text local_1870 [2];
  text local_1830;
  string local_1810 [32];
  text local_17f0 [2];
  text local_17b0;
  string local_1790 [32];
  text local_1770 [2];
  text local_1730;
  string local_1710 [32];
  text local_16f0 [2];
  text local_16b0;
  string local_1690 [32];
  text local_1670 [2];
  text local_1630;
  string local_1610 [32];
  text local_15f0 [2];
  text local_15b0;
  string local_1590 [32];
  text local_1570 [2];
  text local_1530;
  string local_1510 [32];
  text local_14f0 [2];
  text local_14b0;
  string local_1490 [32];
  text local_1470 [2];
  text local_1430;
  string local_1410 [32];
  text local_13f0 [2];
  text local_13b0;
  string local_1390 [32];
  text local_1370 [2];
  text local_1330;
  string local_1310 [32];
  text local_12f0 [2];
  text local_12b0;
  string local_1290 [32];
  text local_1270 [2];
  text local_1230;
  string local_1210 [32];
  text local_11f0 [2];
  text local_11b0;
  string local_1190 [32];
  text local_1170 [2];
  text local_1130;
  string local_1110 [32];
  text local_10f0 [2];
  text local_10b0;
  string local_1090 [32];
  text local_1070 [2];
  text local_1030;
  string local_1010 [32];
  text local_ff0 [2];
  text local_fb0;
  string local_f90 [32];
  text local_f70 [2];
  text local_f30;
  string local_f10 [32];
  text local_ef0 [2];
  text local_eb0;
  string local_e90 [32];
  text local_e70 [2];
  text local_e30;
  string local_e10 [32];
  text local_df0 [2];
  text local_db0;
  string local_d90 [32];
  text local_d70 [2];
  text local_d30;
  string local_d10 [32];
  text local_cf0 [2];
  text local_cb0;
  string local_c90 [32];
  text local_c70 [2];
  text local_c30;
  string local_c10 [32];
  text local_bf0 [2];
  text local_bb0;
  string local_b90 [32];
  text local_b70 [2];
  text local_b30;
  string local_b10 [32];
  text local_af0 [2];
  text local_ab0;
  string local_a90 [32];
  text local_a70 [2];
  text local_a30;
  string local_a10 [32];
  text local_9f0 [2];
  text local_9b0;
  string local_990 [32];
  text local_970 [2];
  text local_930;
  string local_910 [32];
  text local_8f0 [2];
  text local_8b0;
  string local_890 [32];
  text local_870 [2];
  text local_830;
  string local_810 [32];
  text local_7f0 [2];
  text local_7b0;
  string local_790 [32];
  text local_770 [2];
  text local_730;
  string local_710 [32];
  text local_6f0 [2];
  text local_6b0;
  string local_690 [32];
  text local_670 [2];
  text local_630;
  string local_610 [32];
  text local_5f0;
  text local_5d0;
  text local_5b0;
  text local_590;
  text local_570;
  text local_550;
  text local_530;
  text local_510;
  text local_4f0;
  text local_4d0;
  text local_4b0;
  text local_490;
  text local_470;
  text local_450;
  text local_430;
  text local_410;
  text local_3f0;
  text local_3d0;
  text local_3b0;
  text local_390;
  text local_370;
  text local_350;
  text local_330;
  text local_310;
  text local_2f0;
  text local_2d0;
  text local_2b0;
  text local_290;
  text local_270;
  text local_250;
  text local_230;
  text local_210;
  text local_1f0;
  text local_1d0;
  text local_1b0;
  text local_190;
  text local_170;
  text local_150;
  text local_130;
  text local_110;
  text local_f0;
  text local_d0;
  text local_b0;
  text local_90;
  text local_70;
  text local_50;
  
  iVar3 = 0;
  iVar6 = 1;
  do {
    if (iVar6 <= iVar3) {
      return;
    }
    std::__cxx11::string::string((string *)&local_4c78,"",(allocator *)&score);
    std::__cxx11::string::string((string *)&local_5d0,(string *)&local_4c78);
    lest::ctx::ctx(&lest__ctx_setup,lest_env,&local_5d0);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    while (bVar7 = lest__ctx_setup.once != false, lest__ctx_setup.once = false, bVar7) {
      d.has_value_ = false;
      e1.has_value_ = true;
      e1.contained = (storage_t<int>)0x6;
      e2.has_value_ = true;
      e2.contained = (storage_t<int>)0x7;
      if (iVar3 == 0) {
        relop<int,_int,_int>::id1330 = iVar6 + -1;
        iVar6 = iVar6 + 1;
      }
      if (relop<int,_int,_int>::id1330 == iVar3) {
        uVar5 = 1;
        uVar2 = 0;
        while (uVar2 < uVar5) {
          std::__cxx11::string::string
                    ((string *)&local_4c78,"engaged    == engaged",(allocator *)&score);
          std::__cxx11::string::string((string *)&local_5f0,(string *)&local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,&local_5f0);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          while (bVar7 = lest__ctx_section.once != false, lest__ctx_section.once = false, bVar7) {
            local_4cb8.file._M_dataplus._M_p = &e1.has_value_;
            lest::expression_lhs<nonstd::optional_lite::optional<int>const&>::operator==
                      ((result *)&local_4c78,
                       (expression_lhs<nonstd::optional_lite::optional<int>const&> *)&local_4cb8,
                       (optional<int> *)local_4cb8.file._M_dataplus._M_p);
            lest::result::result(&score,(result *)&local_4c78);
            std::__cxx11::string::_M_dispose();
            if (score.passed == false) {
              pfVar4 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,(allocator *)&local_4cd8);
              std::__cxx11::string::string(local_610,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_610);
              local_4cb8.line = 0x532;
              lest::location::location(&local_1bf8,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"e1 == e1",&local_4d62);
              std::__cxx11::string::string((string *)&local_22d0,local_4cf8);
              std::__cxx11::string::string((string *)&local_630,(string *)&score.decomposition);
              lest::failure::failure((failure *)&local_4c78,&local_1bf8,&local_22d0,&local_630);
              lest::failure::failure(pfVar4,(failure *)&local_4c78);
              __cxa_throw(pfVar4,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,&local_4d62);
              std::__cxx11::string::string(local_22f0,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_22f0);
              local_4cb8.line = 0x532;
              lest::location::location(&local_38d8,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"e1 == e1",&local_4d61);
              std::__cxx11::string::string((string *)local_4690,local_4cf8);
              std::__cxx11::string::string((string *)&local_2310,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)&local_4c78,&local_38d8,local_4690,&local_2310,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_4cd8,lest_env);
              std::__cxx11::string::string((string *)&local_50,(string *)&local_4cd8);
              lest::report(poVar1,&local_4c78,&local_50);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              lest::message::~message(&local_4c78);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
            }
            std::__cxx11::string::_M_dispose();
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar5 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<int,_int,_int>::id1331 = iVar6 + -1;
        iVar6 = iVar6 + 1;
      }
      if (relop<int,_int,_int>::id1331 == iVar3) {
        uVar5 = 1;
        uVar2 = 0;
        while (uVar2 < uVar5) {
          std::__cxx11::string::string
                    ((string *)&local_4c78,"engaged    == disengaged",(allocator *)&score);
          std::__cxx11::string::string((string *)local_670,(string *)&local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,local_670);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          while (bVar7 = lest__ctx_section.once != false, lest__ctx_section.once = false, bVar7) {
            bVar7 = nonstd::optional_lite::operator==(&e1,&d);
            local_4d18[0].has_value_ = !bVar7;
            local_4cb8.file._M_dataplus._M_p = &local_4d18[0].has_value_;
            lest::expression_lhs::operator_cast_to_result
                      ((result *)&local_4c78,(expression_lhs *)&local_4cb8);
            lest::result::result(&score,(result *)&local_4c78);
            std::__cxx11::string::_M_dispose();
            if (score.passed == false) {
              pfVar4 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,(allocator *)&local_4cd8);
              std::__cxx11::string::string(local_690,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_690);
              local_4cb8.line = 0x533;
              lest::location::location(&local_1c20,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"!(e1 == d )",&local_4d62);
              std::__cxx11::string::string((string *)local_2350,local_4cf8);
              std::__cxx11::string::string((string *)&local_6b0,(string *)&score.decomposition);
              lest::failure::failure((failure *)&local_4c78,&local_1c20,local_2350,&local_6b0);
              lest::failure::failure(pfVar4,(failure *)&local_4c78);
              __cxa_throw(pfVar4,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,&local_4d62);
              std::__cxx11::string::string(local_2370,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_2370);
              local_4cb8.line = 0x533;
              lest::location::location(local_3928,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"!(e1 == d )",&local_4d61);
              std::__cxx11::string::string((string *)&local_46b0,local_4cf8);
              std::__cxx11::string::string((string *)&local_2390,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)&local_4c78,local_3928,&local_46b0,&local_2390,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_4cd8,lest_env);
              std::__cxx11::string::string((string *)&local_70,(string *)&local_4cd8);
              lest::report(poVar1,&local_4c78,&local_70);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              lest::message::~message(&local_4c78);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
            }
            std::__cxx11::string::_M_dispose();
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar5 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<int,_int,_int>::id1332 = iVar6 + -1;
        iVar6 = iVar6 + 1;
      }
      if (relop<int,_int,_int>::id1332 == iVar3) {
        uVar5 = 1;
        uVar2 = 0;
        while (uVar2 < uVar5) {
          std::__cxx11::string::string
                    ((string *)&local_4c78,"disengaged == engaged",(allocator *)&score);
          std::__cxx11::string::string((string *)local_6f0,(string *)&local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,local_6f0);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          while (bVar7 = lest__ctx_section.once != false, lest__ctx_section.once = false, bVar7) {
            bVar7 = nonstd::optional_lite::operator==(&d,&e1);
            local_4d18[0].has_value_ = !bVar7;
            local_4cb8.file._M_dataplus._M_p = &local_4d18[0].has_value_;
            lest::expression_lhs::operator_cast_to_result
                      ((result *)&local_4c78,(expression_lhs *)&local_4cb8);
            lest::result::result(&score,(result *)&local_4c78);
            std::__cxx11::string::_M_dispose();
            if (score.passed == false) {
              pfVar4 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,(allocator *)&local_4cd8);
              std::__cxx11::string::string(local_710,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_710);
              local_4cb8.line = 0x534;
              lest::location::location(&local_1c48,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"!(d == e1)",&local_4d62);
              std::__cxx11::string::string((string *)local_23d0,local_4cf8);
              std::__cxx11::string::string((string *)&local_730,(string *)&score.decomposition);
              lest::failure::failure((failure *)&local_4c78,&local_1c48,local_23d0,&local_730);
              lest::failure::failure(pfVar4,(failure *)&local_4c78);
              __cxa_throw(pfVar4,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,&local_4d62);
              std::__cxx11::string::string(local_23f0,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_23f0);
              local_4cb8.line = 0x534;
              lest::location::location(local_3978,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"!(d == e1)",&local_4d61);
              std::__cxx11::string::string((string *)&local_46d0,local_4cf8);
              std::__cxx11::string::string((string *)&local_2410,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)&local_4c78,local_3978,&local_46d0,&local_2410,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_4cd8,lest_env);
              std::__cxx11::string::string((string *)&local_90,(string *)&local_4cd8);
              lest::report(poVar1,&local_4c78,&local_90);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              lest::message::~message(&local_4c78);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
            }
            std::__cxx11::string::_M_dispose();
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar5 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<int,_int,_int>::id1334 = iVar6 + -1;
        iVar6 = iVar6 + 1;
      }
      if (relop<int,_int,_int>::id1334 == iVar3) {
        uVar5 = 1;
        uVar2 = 0;
        while (uVar2 < uVar5) {
          std::__cxx11::string::string
                    ((string *)&local_4c78,"engaged    != engaged",(allocator *)&score);
          std::__cxx11::string::string((string *)local_770,(string *)&local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,local_770);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          while (bVar7 = lest__ctx_section.once != false, lest__ctx_section.once = false, bVar7) {
            local_4cb8.file._M_dataplus._M_p = &e1.has_value_;
            lest::expression_lhs<nonstd::optional_lite::optional<int>const&>::operator!=
                      ((result *)&local_4c78,
                       (expression_lhs<nonstd::optional_lite::optional<int>const&> *)&local_4cb8,&e2
                      );
            lest::result::result(&score,(result *)&local_4c78);
            std::__cxx11::string::_M_dispose();
            if (score.passed == false) {
              pfVar4 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,(allocator *)&local_4cd8);
              std::__cxx11::string::string(local_790,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_790);
              local_4cb8.line = 0x536;
              lest::location::location(&local_1c70,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"e1 != e2",&local_4d62);
              std::__cxx11::string::string((string *)local_2450,local_4cf8);
              std::__cxx11::string::string((string *)&local_7b0,(string *)&score.decomposition);
              lest::failure::failure((failure *)&local_4c78,&local_1c70,local_2450,&local_7b0);
              lest::failure::failure(pfVar4,(failure *)&local_4c78);
              __cxa_throw(pfVar4,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,&local_4d62);
              std::__cxx11::string::string(local_2470,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_2470);
              local_4cb8.line = 0x536;
              lest::location::location(local_39c8,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"e1 != e2",&local_4d61);
              std::__cxx11::string::string((string *)&local_46f0,local_4cf8);
              std::__cxx11::string::string((string *)&local_2490,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)&local_4c78,local_39c8,&local_46f0,&local_2490,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_4cd8,lest_env);
              std::__cxx11::string::string((string *)&local_b0,(string *)&local_4cd8);
              lest::report(poVar1,&local_4c78,&local_b0);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              lest::message::~message(&local_4c78);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
            }
            std::__cxx11::string::_M_dispose();
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar5 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<int,_int,_int>::id1335 = iVar6 + -1;
        iVar6 = iVar6 + 1;
      }
      if (relop<int,_int,_int>::id1335 == iVar3) {
        uVar5 = 1;
        uVar2 = 0;
        while (uVar2 < uVar5) {
          std::__cxx11::string::string
                    ((string *)&local_4c78,"engaged    != disengaged",(allocator *)&score);
          std::__cxx11::string::string((string *)local_7f0,(string *)&local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,local_7f0);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          while (bVar7 = lest__ctx_section.once != false, lest__ctx_section.once = false, bVar7) {
            local_4cb8.file._M_dataplus._M_p = &e1.has_value_;
            lest::expression_lhs<nonstd::optional_lite::optional<int>const&>::operator!=
                      ((result *)&local_4c78,
                       (expression_lhs<nonstd::optional_lite::optional<int>const&> *)&local_4cb8,&d)
            ;
            lest::result::result(&score,(result *)&local_4c78);
            std::__cxx11::string::_M_dispose();
            if (score.passed == false) {
              pfVar4 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,(allocator *)&local_4cd8);
              std::__cxx11::string::string(local_810,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_810);
              local_4cb8.line = 0x537;
              lest::location::location(&local_1c98,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"e1 != d",&local_4d62);
              std::__cxx11::string::string((string *)local_24d0,local_4cf8);
              std::__cxx11::string::string((string *)&local_830,(string *)&score.decomposition);
              lest::failure::failure((failure *)&local_4c78,&local_1c98,local_24d0,&local_830);
              lest::failure::failure(pfVar4,(failure *)&local_4c78);
              __cxa_throw(pfVar4,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,&local_4d62);
              std::__cxx11::string::string(local_24f0,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_24f0);
              local_4cb8.line = 0x537;
              lest::location::location(local_3a18,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"e1 != d",&local_4d61);
              std::__cxx11::string::string((string *)&local_4710,local_4cf8);
              std::__cxx11::string::string((string *)&local_2510,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)&local_4c78,local_3a18,&local_4710,&local_2510,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_4cd8,lest_env);
              std::__cxx11::string::string((string *)&local_d0,(string *)&local_4cd8);
              lest::report(poVar1,&local_4c78,&local_d0);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              lest::message::~message(&local_4c78);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
            }
            std::__cxx11::string::_M_dispose();
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar5 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<int,_int,_int>::id1336 = iVar6 + -1;
        iVar6 = iVar6 + 1;
      }
      if (relop<int,_int,_int>::id1336 == iVar3) {
        uVar5 = 1;
        uVar2 = 0;
        while (uVar2 < uVar5) {
          std::__cxx11::string::string
                    ((string *)&local_4c78,"disengaged != engaged",(allocator *)&score);
          std::__cxx11::string::string((string *)local_870,(string *)&local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,local_870);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          while (bVar7 = lest__ctx_section.once != false, lest__ctx_section.once = false, bVar7) {
            local_4cb8.file._M_dataplus._M_p = &d.has_value_;
            lest::expression_lhs<nonstd::optional_lite::optional<int>const&>::operator!=
                      ((result *)&local_4c78,
                       (expression_lhs<nonstd::optional_lite::optional<int>const&> *)&local_4cb8,&e2
                      );
            lest::result::result(&score,(result *)&local_4c78);
            std::__cxx11::string::_M_dispose();
            if (score.passed == false) {
              pfVar4 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,(allocator *)&local_4cd8);
              std::__cxx11::string::string(local_890,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_890);
              local_4cb8.line = 0x538;
              lest::location::location(&local_1cc0,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"d != e2",&local_4d62);
              std::__cxx11::string::string((string *)local_2550,local_4cf8);
              std::__cxx11::string::string((string *)&local_8b0,(string *)&score.decomposition);
              lest::failure::failure((failure *)&local_4c78,&local_1cc0,local_2550,&local_8b0);
              lest::failure::failure(pfVar4,(failure *)&local_4c78);
              __cxa_throw(pfVar4,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,&local_4d62);
              std::__cxx11::string::string(local_2570,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_2570);
              local_4cb8.line = 0x538;
              lest::location::location(local_3a68,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"d != e2",&local_4d61);
              std::__cxx11::string::string((string *)&local_4730,local_4cf8);
              std::__cxx11::string::string((string *)&local_2590,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)&local_4c78,local_3a68,&local_4730,&local_2590,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_4cd8,lest_env);
              std::__cxx11::string::string((string *)&local_f0,(string *)&local_4cd8);
              lest::report(poVar1,&local_4c78,&local_f0);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              lest::message::~message(&local_4c78);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
            }
            std::__cxx11::string::_M_dispose();
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar5 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<int,_int,_int>::id1338 = iVar6 + -1;
        iVar6 = iVar6 + 1;
      }
      if (relop<int,_int,_int>::id1338 == iVar3) {
        uVar5 = 1;
        uVar2 = 0;
        while (uVar2 < uVar5) {
          std::__cxx11::string::string
                    ((string *)&local_4c78,"engaged    <  engaged",(allocator *)&score);
          std::__cxx11::string::string((string *)local_8f0,(string *)&local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,local_8f0);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          while (bVar7 = lest__ctx_section.once != false, lest__ctx_section.once = false, bVar7) {
            local_4cb8.file._M_dataplus._M_p = &e1.has_value_;
            lest::expression_lhs<nonstd::optional_lite::optional<int>const&>::operator<
                      ((result *)&local_4c78,
                       (expression_lhs<nonstd::optional_lite::optional<int>const&> *)&local_4cb8,&e2
                      );
            lest::result::result(&score,(result *)&local_4c78);
            std::__cxx11::string::_M_dispose();
            if (score.passed == false) {
              pfVar4 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,(allocator *)&local_4cd8);
              std::__cxx11::string::string(local_910,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_910);
              local_4cb8.line = 0x53a;
              lest::location::location(&local_1ce8,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"e1 < e2",&local_4d62);
              std::__cxx11::string::string((string *)local_25d0,local_4cf8);
              std::__cxx11::string::string((string *)&local_930,(string *)&score.decomposition);
              lest::failure::failure((failure *)&local_4c78,&local_1ce8,local_25d0,&local_930);
              lest::failure::failure(pfVar4,(failure *)&local_4c78);
              __cxa_throw(pfVar4,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,&local_4d62);
              std::__cxx11::string::string(local_25f0,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_25f0);
              local_4cb8.line = 0x53a;
              lest::location::location(local_3ab8,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"e1 < e2",&local_4d61);
              std::__cxx11::string::string((string *)&local_4750,local_4cf8);
              std::__cxx11::string::string((string *)&local_2610,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)&local_4c78,local_3ab8,&local_4750,&local_2610,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_4cd8,lest_env);
              std::__cxx11::string::string((string *)&local_110,(string *)&local_4cd8);
              lest::report(poVar1,&local_4c78,&local_110);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              lest::message::~message(&local_4c78);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
            }
            std::__cxx11::string::_M_dispose();
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar5 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<int,_int,_int>::id1339 = iVar6 + -1;
        iVar6 = iVar6 + 1;
      }
      if (relop<int,_int,_int>::id1339 == iVar3) {
        uVar5 = 1;
        uVar2 = 0;
        while (uVar2 < uVar5) {
          std::__cxx11::string::string
                    ((string *)&local_4c78,"engaged    <  disengaged",(allocator *)&score);
          std::__cxx11::string::string((string *)local_970,(string *)&local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,local_970);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          while (bVar7 = lest__ctx_section.once != false, lest__ctx_section.once = false, bVar7) {
            bVar7 = nonstd::optional_lite::operator<(&e1,&d);
            local_4d18[0].has_value_ = !bVar7;
            local_4cb8.file._M_dataplus._M_p = &local_4d18[0].has_value_;
            lest::expression_lhs::operator_cast_to_result
                      ((result *)&local_4c78,(expression_lhs *)&local_4cb8);
            lest::result::result(&score,(result *)&local_4c78);
            std::__cxx11::string::_M_dispose();
            if (score.passed == false) {
              pfVar4 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,(allocator *)&local_4cd8);
              std::__cxx11::string::string(local_990,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_990);
              local_4cb8.line = 0x53b;
              lest::location::location(&local_1d10,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"!(e1 < d )",&local_4d62);
              std::__cxx11::string::string((string *)local_2650,local_4cf8);
              std::__cxx11::string::string((string *)&local_9b0,(string *)&score.decomposition);
              lest::failure::failure((failure *)&local_4c78,&local_1d10,local_2650,&local_9b0);
              lest::failure::failure(pfVar4,(failure *)&local_4c78);
              __cxa_throw(pfVar4,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,&local_4d62);
              std::__cxx11::string::string(local_2670,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_2670);
              local_4cb8.line = 0x53b;
              lest::location::location(local_3b08,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"!(e1 < d )",&local_4d61);
              std::__cxx11::string::string((string *)&local_4770,local_4cf8);
              std::__cxx11::string::string((string *)&local_2690,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)&local_4c78,local_3b08,&local_4770,&local_2690,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_4cd8,lest_env);
              std::__cxx11::string::string((string *)&local_130,(string *)&local_4cd8);
              lest::report(poVar1,&local_4c78,&local_130);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              lest::message::~message(&local_4c78);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
            }
            std::__cxx11::string::_M_dispose();
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar5 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<int,_int,_int>::id1340 = iVar6 + -1;
        iVar6 = iVar6 + 1;
      }
      if (relop<int,_int,_int>::id1340 == iVar3) {
        uVar5 = 1;
        uVar2 = 0;
        while (uVar2 < uVar5) {
          std::__cxx11::string::string
                    ((string *)&local_4c78,"disengaged <  engaged",(allocator *)&score);
          std::__cxx11::string::string((string *)local_9f0,(string *)&local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,local_9f0);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          while (bVar7 = lest__ctx_section.once != false, lest__ctx_section.once = false, bVar7) {
            local_4cb8.file._M_dataplus._M_p = &d.has_value_;
            lest::expression_lhs<nonstd::optional_lite::optional<int>const&>::operator<
                      ((result *)&local_4c78,
                       (expression_lhs<nonstd::optional_lite::optional<int>const&> *)&local_4cb8,&e2
                      );
            lest::result::result(&score,(result *)&local_4c78);
            std::__cxx11::string::_M_dispose();
            if (score.passed == false) {
              pfVar4 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,(allocator *)&local_4cd8);
              std::__cxx11::string::string(local_a10,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_a10);
              local_4cb8.line = 0x53c;
              lest::location::location(&local_1d38,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"d < e2",&local_4d62);
              std::__cxx11::string::string((string *)local_26d0,local_4cf8);
              std::__cxx11::string::string((string *)&local_a30,(string *)&score.decomposition);
              lest::failure::failure((failure *)&local_4c78,&local_1d38,local_26d0,&local_a30);
              lest::failure::failure(pfVar4,(failure *)&local_4c78);
              __cxa_throw(pfVar4,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,&local_4d62);
              std::__cxx11::string::string(local_26f0,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_26f0);
              local_4cb8.line = 0x53c;
              lest::location::location(local_3b58,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"d < e2",&local_4d61);
              std::__cxx11::string::string((string *)&local_4790,local_4cf8);
              std::__cxx11::string::string((string *)&local_2710,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)&local_4c78,local_3b58,&local_4790,&local_2710,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_4cd8,lest_env);
              std::__cxx11::string::string((string *)&local_150,(string *)&local_4cd8);
              lest::report(poVar1,&local_4c78,&local_150);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              lest::message::~message(&local_4c78);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
            }
            std::__cxx11::string::_M_dispose();
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar5 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<int,_int,_int>::id1342 = iVar6 + -1;
        iVar6 = iVar6 + 1;
      }
      if (relop<int,_int,_int>::id1342 == iVar3) {
        uVar5 = 1;
        uVar2 = 0;
        while (uVar2 < uVar5) {
          std::__cxx11::string::string
                    ((string *)&local_4c78,"engaged    <= engaged",(allocator *)&score);
          std::__cxx11::string::string((string *)local_a70,(string *)&local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,local_a70);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          while (bVar7 = lest__ctx_section.once != false, lest__ctx_section.once = false, bVar7) {
            local_4cb8.file._M_dataplus._M_p = &e1.has_value_;
            lest::expression_lhs<nonstd::optional_lite::optional<int>const&>::operator<=
                      ((result *)&local_4c78,
                       (expression_lhs<nonstd::optional_lite::optional<int>const&> *)&local_4cb8,
                       (optional<int> *)local_4cb8.file._M_dataplus._M_p);
            lest::result::result(&score,(result *)&local_4c78);
            std::__cxx11::string::_M_dispose();
            if (score.passed == false) {
              pfVar4 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,(allocator *)&local_4cd8);
              std::__cxx11::string::string(local_a90,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_a90);
              local_4cb8.line = 0x53e;
              lest::location::location(&local_1d60,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"e1 <= e1",&local_4d62);
              std::__cxx11::string::string((string *)local_2750,local_4cf8);
              std::__cxx11::string::string((string *)&local_ab0,(string *)&score.decomposition);
              lest::failure::failure((failure *)&local_4c78,&local_1d60,local_2750,&local_ab0);
              lest::failure::failure(pfVar4,(failure *)&local_4c78);
              __cxa_throw(pfVar4,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,&local_4d62);
              std::__cxx11::string::string(local_2770,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_2770);
              local_4cb8.line = 0x53e;
              lest::location::location(local_3ba8,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"e1 <= e1",&local_4d61);
              std::__cxx11::string::string((string *)&local_47b0,local_4cf8);
              std::__cxx11::string::string((string *)&local_2790,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)&local_4c78,local_3ba8,&local_47b0,&local_2790,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_4cd8,lest_env);
              std::__cxx11::string::string((string *)&local_170,(string *)&local_4cd8);
              lest::report(poVar1,&local_4c78,&local_170);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              lest::message::~message(&local_4c78);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
            }
            std::__cxx11::string::_M_dispose();
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar5 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<int,_int,_int>::id1343 = iVar6 + -1;
        iVar6 = iVar6 + 1;
      }
      if (relop<int,_int,_int>::id1343 == iVar3) {
        uVar5 = 1;
        uVar2 = 0;
        while (uVar2 < uVar5) {
          std::__cxx11::string::string
                    ((string *)&local_4c78,"engaged    <= engaged",(allocator *)&score);
          std::__cxx11::string::string((string *)local_af0,(string *)&local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,local_af0);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          while (bVar7 = lest__ctx_section.once != false, lest__ctx_section.once = false, bVar7) {
            local_4cb8.file._M_dataplus._M_p = &e1.has_value_;
            lest::expression_lhs<nonstd::optional_lite::optional<int>const&>::operator<=
                      ((result *)&local_4c78,
                       (expression_lhs<nonstd::optional_lite::optional<int>const&> *)&local_4cb8,&e2
                      );
            lest::result::result(&score,(result *)&local_4c78);
            std::__cxx11::string::_M_dispose();
            if (score.passed == false) {
              pfVar4 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,(allocator *)&local_4cd8);
              std::__cxx11::string::string(local_b10,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_b10);
              local_4cb8.line = 0x53f;
              lest::location::location(&local_1d88,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"e1 <= e2",&local_4d62);
              std::__cxx11::string::string((string *)local_27d0,local_4cf8);
              std::__cxx11::string::string((string *)&local_b30,(string *)&score.decomposition);
              lest::failure::failure((failure *)&local_4c78,&local_1d88,local_27d0,&local_b30);
              lest::failure::failure(pfVar4,(failure *)&local_4c78);
              __cxa_throw(pfVar4,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,&local_4d62);
              std::__cxx11::string::string(local_27f0,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_27f0);
              local_4cb8.line = 0x53f;
              lest::location::location(local_3bf8,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"e1 <= e2",&local_4d61);
              std::__cxx11::string::string((string *)&local_47d0,local_4cf8);
              std::__cxx11::string::string((string *)&local_2810,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)&local_4c78,local_3bf8,&local_47d0,&local_2810,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_4cd8,lest_env);
              std::__cxx11::string::string((string *)&local_190,(string *)&local_4cd8);
              lest::report(poVar1,&local_4c78,&local_190);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              lest::message::~message(&local_4c78);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
            }
            std::__cxx11::string::_M_dispose();
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar5 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<int,_int,_int>::id1344 = iVar6 + -1;
        iVar6 = iVar6 + 1;
      }
      if (relop<int,_int,_int>::id1344 == iVar3) {
        uVar5 = 1;
        uVar2 = 0;
        while (uVar2 < uVar5) {
          std::__cxx11::string::string
                    ((string *)&local_4c78,"engaged    <= disengaged",(allocator *)&score);
          std::__cxx11::string::string((string *)local_b70,(string *)&local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,local_b70);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          while (bVar7 = lest__ctx_section.once != false, lest__ctx_section.once = false, bVar7) {
            bVar7 = nonstd::optional_lite::operator<=(&e1,&d);
            local_4d18[0].has_value_ = !bVar7;
            local_4cb8.file._M_dataplus._M_p = &local_4d18[0].has_value_;
            lest::expression_lhs::operator_cast_to_result
                      ((result *)&local_4c78,(expression_lhs *)&local_4cb8);
            lest::result::result(&score,(result *)&local_4c78);
            std::__cxx11::string::_M_dispose();
            if (score.passed == false) {
              pfVar4 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,(allocator *)&local_4cd8);
              std::__cxx11::string::string(local_b90,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_b90);
              local_4cb8.line = 0x540;
              lest::location::location(&local_1db0,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"!(e1 <= d )",&local_4d62);
              std::__cxx11::string::string((string *)local_2850,local_4cf8);
              std::__cxx11::string::string((string *)&local_bb0,(string *)&score.decomposition);
              lest::failure::failure((failure *)&local_4c78,&local_1db0,local_2850,&local_bb0);
              lest::failure::failure(pfVar4,(failure *)&local_4c78);
              __cxa_throw(pfVar4,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,&local_4d62);
              std::__cxx11::string::string(local_2870,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_2870);
              local_4cb8.line = 0x540;
              lest::location::location(local_3c48,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"!(e1 <= d )",&local_4d61);
              std::__cxx11::string::string((string *)&local_47f0,local_4cf8);
              std::__cxx11::string::string((string *)&local_2890,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)&local_4c78,local_3c48,&local_47f0,&local_2890,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_4cd8,lest_env);
              std::__cxx11::string::string((string *)&local_1b0,(string *)&local_4cd8);
              lest::report(poVar1,&local_4c78,&local_1b0);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              lest::message::~message(&local_4c78);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
            }
            std::__cxx11::string::_M_dispose();
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar5 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<int,_int,_int>::id1345 = iVar6 + -1;
        iVar6 = iVar6 + 1;
      }
      if (relop<int,_int,_int>::id1345 == iVar3) {
        uVar5 = 1;
        uVar2 = 0;
        while (uVar2 < uVar5) {
          std::__cxx11::string::string
                    ((string *)&local_4c78,"disengaged <= engaged",(allocator *)&score);
          std::__cxx11::string::string((string *)local_bf0,(string *)&local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,local_bf0);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          while (bVar7 = lest__ctx_section.once != false, lest__ctx_section.once = false, bVar7) {
            local_4cb8.file._M_dataplus._M_p = &d.has_value_;
            lest::expression_lhs<nonstd::optional_lite::optional<int>const&>::operator<=
                      ((result *)&local_4c78,
                       (expression_lhs<nonstd::optional_lite::optional<int>const&> *)&local_4cb8,&e2
                      );
            lest::result::result(&score,(result *)&local_4c78);
            std::__cxx11::string::_M_dispose();
            if (score.passed == false) {
              pfVar4 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,(allocator *)&local_4cd8);
              std::__cxx11::string::string(local_c10,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_c10);
              local_4cb8.line = 0x541;
              lest::location::location(&local_1dd8,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"d <= e2",&local_4d62);
              std::__cxx11::string::string((string *)local_28d0,local_4cf8);
              std::__cxx11::string::string((string *)&local_c30,(string *)&score.decomposition);
              lest::failure::failure((failure *)&local_4c78,&local_1dd8,local_28d0,&local_c30);
              lest::failure::failure(pfVar4,(failure *)&local_4c78);
              __cxa_throw(pfVar4,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,&local_4d62);
              std::__cxx11::string::string(local_28f0,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_28f0);
              local_4cb8.line = 0x541;
              lest::location::location(local_3c98,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"d <= e2",&local_4d61);
              std::__cxx11::string::string((string *)&local_4810,local_4cf8);
              std::__cxx11::string::string((string *)&local_2910,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)&local_4c78,local_3c98,&local_4810,&local_2910,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_4cd8,lest_env);
              std::__cxx11::string::string((string *)&local_1d0,(string *)&local_4cd8);
              lest::report(poVar1,&local_4c78,&local_1d0);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              lest::message::~message(&local_4c78);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
            }
            std::__cxx11::string::_M_dispose();
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar5 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<int,_int,_int>::id1347 = iVar6 + -1;
        iVar6 = iVar6 + 1;
      }
      if (relop<int,_int,_int>::id1347 == iVar3) {
        uVar5 = 1;
        uVar2 = 0;
        while (uVar2 < uVar5) {
          std::__cxx11::string::string
                    ((string *)&local_4c78,"engaged    >  engaged",(allocator *)&score);
          std::__cxx11::string::string((string *)local_c70,(string *)&local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,local_c70);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          while (bVar7 = lest__ctx_section.once != false, lest__ctx_section.once = false, bVar7) {
            local_4cb8.file._M_dataplus._M_p = &e2.has_value_;
            lest::expression_lhs<nonstd::optional_lite::optional<int>const&>::operator>
                      ((result *)&local_4c78,
                       (expression_lhs<nonstd::optional_lite::optional<int>const&> *)&local_4cb8,&e1
                      );
            lest::result::result(&score,(result *)&local_4c78);
            std::__cxx11::string::_M_dispose();
            if (score.passed == false) {
              pfVar4 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,(allocator *)&local_4cd8);
              std::__cxx11::string::string(local_c90,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_c90);
              local_4cb8.line = 0x543;
              lest::location::location(&local_1e00,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"e2 > e1",&local_4d62);
              std::__cxx11::string::string((string *)local_2950,local_4cf8);
              std::__cxx11::string::string((string *)&local_cb0,(string *)&score.decomposition);
              lest::failure::failure((failure *)&local_4c78,&local_1e00,local_2950,&local_cb0);
              lest::failure::failure(pfVar4,(failure *)&local_4c78);
              __cxa_throw(pfVar4,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,&local_4d62);
              std::__cxx11::string::string(local_2970,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_2970);
              local_4cb8.line = 0x543;
              lest::location::location(local_3ce8,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"e2 > e1",&local_4d61);
              std::__cxx11::string::string((string *)&local_4830,local_4cf8);
              std::__cxx11::string::string((string *)&local_2990,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)&local_4c78,local_3ce8,&local_4830,&local_2990,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_4cd8,lest_env);
              std::__cxx11::string::string((string *)&local_1f0,(string *)&local_4cd8);
              lest::report(poVar1,&local_4c78,&local_1f0);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              lest::message::~message(&local_4c78);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
            }
            std::__cxx11::string::_M_dispose();
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar5 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<int,_int,_int>::id1348 = iVar6 + -1;
        iVar6 = iVar6 + 1;
      }
      if (relop<int,_int,_int>::id1348 == iVar3) {
        uVar5 = 1;
        uVar2 = 0;
        while (uVar2 < uVar5) {
          std::__cxx11::string::string
                    ((string *)&local_4c78,"engaged    >  disengaged",(allocator *)&score);
          std::__cxx11::string::string((string *)local_cf0,(string *)&local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,local_cf0);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          while (bVar7 = lest__ctx_section.once != false, lest__ctx_section.once = false, bVar7) {
            local_4cb8.file._M_dataplus._M_p = &e2.has_value_;
            lest::expression_lhs<nonstd::optional_lite::optional<int>const&>::operator>
                      ((result *)&local_4c78,
                       (expression_lhs<nonstd::optional_lite::optional<int>const&> *)&local_4cb8,&d)
            ;
            lest::result::result(&score,(result *)&local_4c78);
            std::__cxx11::string::_M_dispose();
            if (score.passed == false) {
              pfVar4 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,(allocator *)&local_4cd8);
              std::__cxx11::string::string(local_d10,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_d10);
              local_4cb8.line = 0x544;
              lest::location::location(&local_1e28,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"e2 > d",&local_4d62);
              std::__cxx11::string::string((string *)local_29d0,local_4cf8);
              std::__cxx11::string::string((string *)&local_d30,(string *)&score.decomposition);
              lest::failure::failure((failure *)&local_4c78,&local_1e28,local_29d0,&local_d30);
              lest::failure::failure(pfVar4,(failure *)&local_4c78);
              __cxa_throw(pfVar4,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,&local_4d62);
              std::__cxx11::string::string(local_29f0,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_29f0);
              local_4cb8.line = 0x544;
              lest::location::location(local_3d38,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"e2 > d",&local_4d61);
              std::__cxx11::string::string((string *)&local_4850,local_4cf8);
              std::__cxx11::string::string((string *)&local_2a10,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)&local_4c78,local_3d38,&local_4850,&local_2a10,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_4cd8,lest_env);
              std::__cxx11::string::string((string *)&local_210,(string *)&local_4cd8);
              lest::report(poVar1,&local_4c78,&local_210);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              lest::message::~message(&local_4c78);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
            }
            std::__cxx11::string::_M_dispose();
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar5 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<int,_int,_int>::id1349 = iVar6 + -1;
        iVar6 = iVar6 + 1;
      }
      if (relop<int,_int,_int>::id1349 == iVar3) {
        uVar5 = 1;
        uVar2 = 0;
        while (uVar2 < uVar5) {
          std::__cxx11::string::string
                    ((string *)&local_4c78,"disengaged >  engaged",(allocator *)&score);
          std::__cxx11::string::string((string *)local_d70,(string *)&local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,local_d70);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          while (bVar7 = lest__ctx_section.once != false, lest__ctx_section.once = false, bVar7) {
            bVar7 = nonstd::optional_lite::operator<(&e1,&d);
            local_4d18[0].has_value_ = !bVar7;
            local_4cb8.file._M_dataplus._M_p = &local_4d18[0].has_value_;
            lest::expression_lhs::operator_cast_to_result
                      ((result *)&local_4c78,(expression_lhs *)&local_4cb8);
            lest::result::result(&score,(result *)&local_4c78);
            std::__cxx11::string::_M_dispose();
            if (score.passed == false) {
              pfVar4 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,(allocator *)&local_4cd8);
              std::__cxx11::string::string(local_d90,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_d90);
              local_4cb8.line = 0x545;
              lest::location::location(&local_1e50,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"!(d > e1)",&local_4d62);
              std::__cxx11::string::string((string *)local_2a50,local_4cf8);
              std::__cxx11::string::string((string *)&local_db0,(string *)&score.decomposition);
              lest::failure::failure((failure *)&local_4c78,&local_1e50,local_2a50,&local_db0);
              lest::failure::failure(pfVar4,(failure *)&local_4c78);
              __cxa_throw(pfVar4,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,&local_4d62);
              std::__cxx11::string::string(local_2a70,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_2a70);
              local_4cb8.line = 0x545;
              lest::location::location(local_3d88,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"!(d > e1)",&local_4d61);
              std::__cxx11::string::string((string *)&local_4870,local_4cf8);
              std::__cxx11::string::string((string *)&local_2a90,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)&local_4c78,local_3d88,&local_4870,&local_2a90,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_4cd8,lest_env);
              std::__cxx11::string::string((string *)&local_230,(string *)&local_4cd8);
              lest::report(poVar1,&local_4c78,&local_230);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              lest::message::~message(&local_4c78);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
            }
            std::__cxx11::string::_M_dispose();
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar5 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<int,_int,_int>::id1351 = iVar6 + -1;
        iVar6 = iVar6 + 1;
      }
      if (relop<int,_int,_int>::id1351 == iVar3) {
        uVar5 = 1;
        uVar2 = 0;
        while (uVar2 < uVar5) {
          std::__cxx11::string::string
                    ((string *)&local_4c78,"engaged    >= engaged",(allocator *)&score);
          std::__cxx11::string::string((string *)local_df0,(string *)&local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,local_df0);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          while (bVar7 = lest__ctx_section.once != false, lest__ctx_section.once = false, bVar7) {
            local_4cb8.file._M_dataplus._M_p = &e1.has_value_;
            lest::expression_lhs<nonstd::optional_lite::optional<int>const&>::operator>=
                      ((result *)&local_4c78,
                       (expression_lhs<nonstd::optional_lite::optional<int>const&> *)&local_4cb8,
                       (optional<int> *)local_4cb8.file._M_dataplus._M_p);
            lest::result::result(&score,(result *)&local_4c78);
            std::__cxx11::string::_M_dispose();
            if (score.passed == false) {
              pfVar4 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,(allocator *)&local_4cd8);
              std::__cxx11::string::string(local_e10,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_e10);
              local_4cb8.line = 0x547;
              lest::location::location(&local_1e78,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"e1 >= e1",&local_4d62);
              std::__cxx11::string::string((string *)local_2ad0,local_4cf8);
              std::__cxx11::string::string((string *)&local_e30,(string *)&score.decomposition);
              lest::failure::failure((failure *)&local_4c78,&local_1e78,local_2ad0,&local_e30);
              lest::failure::failure(pfVar4,(failure *)&local_4c78);
              __cxa_throw(pfVar4,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,&local_4d62);
              std::__cxx11::string::string(local_2af0,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_2af0);
              local_4cb8.line = 0x547;
              lest::location::location(local_3dd8,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"e1 >= e1",&local_4d61);
              std::__cxx11::string::string((string *)&local_4890,local_4cf8);
              std::__cxx11::string::string((string *)&local_2b10,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)&local_4c78,local_3dd8,&local_4890,&local_2b10,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_4cd8,lest_env);
              std::__cxx11::string::string((string *)&local_250,(string *)&local_4cd8);
              lest::report(poVar1,&local_4c78,&local_250);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              lest::message::~message(&local_4c78);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
            }
            std::__cxx11::string::_M_dispose();
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar5 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<int,_int,_int>::id1352 = iVar6 + -1;
        iVar6 = iVar6 + 1;
      }
      if (relop<int,_int,_int>::id1352 == iVar3) {
        uVar5 = 1;
        uVar2 = 0;
        while (uVar2 < uVar5) {
          std::__cxx11::string::string
                    ((string *)&local_4c78,"engaged    >= engaged",(allocator *)&score);
          std::__cxx11::string::string((string *)local_e70,(string *)&local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,local_e70);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          while (bVar7 = lest__ctx_section.once != false, lest__ctx_section.once = false, bVar7) {
            local_4cb8.file._M_dataplus._M_p = &e2.has_value_;
            lest::expression_lhs<nonstd::optional_lite::optional<int>const&>::operator>=
                      ((result *)&local_4c78,
                       (expression_lhs<nonstd::optional_lite::optional<int>const&> *)&local_4cb8,&e1
                      );
            lest::result::result(&score,(result *)&local_4c78);
            std::__cxx11::string::_M_dispose();
            if (score.passed == false) {
              pfVar4 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,(allocator *)&local_4cd8);
              std::__cxx11::string::string(local_e90,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_e90);
              local_4cb8.line = 0x548;
              lest::location::location(&local_1ea0,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"e2 >= e1",&local_4d62);
              std::__cxx11::string::string((string *)local_2b50,local_4cf8);
              std::__cxx11::string::string((string *)&local_eb0,(string *)&score.decomposition);
              lest::failure::failure((failure *)&local_4c78,&local_1ea0,local_2b50,&local_eb0);
              lest::failure::failure(pfVar4,(failure *)&local_4c78);
              __cxa_throw(pfVar4,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,&local_4d62);
              std::__cxx11::string::string(local_2b70,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_2b70);
              local_4cb8.line = 0x548;
              lest::location::location(local_3e28,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"e2 >= e1",&local_4d61);
              std::__cxx11::string::string((string *)&local_48b0,local_4cf8);
              std::__cxx11::string::string((string *)&local_2b90,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)&local_4c78,local_3e28,&local_48b0,&local_2b90,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_4cd8,lest_env);
              std::__cxx11::string::string((string *)&local_270,(string *)&local_4cd8);
              lest::report(poVar1,&local_4c78,&local_270);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              lest::message::~message(&local_4c78);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
            }
            std::__cxx11::string::_M_dispose();
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar5 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<int,_int,_int>::id1353 = iVar6 + -1;
        iVar6 = iVar6 + 1;
      }
      if (relop<int,_int,_int>::id1353 == iVar3) {
        uVar5 = 1;
        uVar2 = 0;
        while (uVar2 < uVar5) {
          std::__cxx11::string::string
                    ((string *)&local_4c78,"engaged    >= disengaged",(allocator *)&score);
          std::__cxx11::string::string((string *)local_ef0,(string *)&local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,local_ef0);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          while (bVar7 = lest__ctx_section.once != false, lest__ctx_section.once = false, bVar7) {
            local_4cb8.file._M_dataplus._M_p = &e2.has_value_;
            lest::expression_lhs<nonstd::optional_lite::optional<int>const&>::operator>=
                      ((result *)&local_4c78,
                       (expression_lhs<nonstd::optional_lite::optional<int>const&> *)&local_4cb8,&d)
            ;
            lest::result::result(&score,(result *)&local_4c78);
            std::__cxx11::string::_M_dispose();
            if (score.passed == false) {
              pfVar4 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,(allocator *)&local_4cd8);
              std::__cxx11::string::string(local_f10,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_f10);
              local_4cb8.line = 0x549;
              lest::location::location(&local_1ec8,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"e2 >= d",&local_4d62);
              std::__cxx11::string::string((string *)local_2bd0,local_4cf8);
              std::__cxx11::string::string((string *)&local_f30,(string *)&score.decomposition);
              lest::failure::failure((failure *)&local_4c78,&local_1ec8,local_2bd0,&local_f30);
              lest::failure::failure(pfVar4,(failure *)&local_4c78);
              __cxa_throw(pfVar4,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,&local_4d62);
              std::__cxx11::string::string(local_2bf0,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_2bf0);
              local_4cb8.line = 0x549;
              lest::location::location(local_3e78,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"e2 >= d",&local_4d61);
              std::__cxx11::string::string((string *)&local_48d0,local_4cf8);
              std::__cxx11::string::string((string *)&local_2c10,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)&local_4c78,local_3e78,&local_48d0,&local_2c10,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_4cd8,lest_env);
              std::__cxx11::string::string((string *)&local_290,(string *)&local_4cd8);
              lest::report(poVar1,&local_4c78,&local_290);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              lest::message::~message(&local_4c78);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
            }
            std::__cxx11::string::_M_dispose();
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar5 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<int,_int,_int>::id1354 = iVar6 + -1;
        iVar6 = iVar6 + 1;
      }
      if (relop<int,_int,_int>::id1354 == iVar3) {
        uVar5 = 1;
        uVar2 = 0;
        while (uVar2 < uVar5) {
          std::__cxx11::string::string
                    ((string *)&local_4c78,"disengaged >= engaged",(allocator *)&score);
          std::__cxx11::string::string((string *)local_f70,(string *)&local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,local_f70);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          while (bVar7 = lest__ctx_section.once != false, lest__ctx_section.once = false, bVar7) {
            bVar7 = nonstd::optional_lite::operator>=(&d,&e1);
            local_4d18[0].has_value_ = !bVar7;
            local_4cb8.file._M_dataplus._M_p = &local_4d18[0].has_value_;
            lest::expression_lhs::operator_cast_to_result
                      ((result *)&local_4c78,(expression_lhs *)&local_4cb8);
            lest::result::result(&score,(result *)&local_4c78);
            std::__cxx11::string::_M_dispose();
            if (score.passed == false) {
              pfVar4 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,(allocator *)&local_4cd8);
              std::__cxx11::string::string(local_f90,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_f90);
              local_4cb8.line = 0x54a;
              lest::location::location(&local_1ef0,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"!(d >= e1)",&local_4d62);
              std::__cxx11::string::string((string *)local_2c50,local_4cf8);
              std::__cxx11::string::string((string *)&local_fb0,(string *)&score.decomposition);
              lest::failure::failure((failure *)&local_4c78,&local_1ef0,local_2c50,&local_fb0);
              lest::failure::failure(pfVar4,(failure *)&local_4c78);
              __cxa_throw(pfVar4,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,&local_4d62);
              std::__cxx11::string::string(local_2c70,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_2c70);
              local_4cb8.line = 0x54a;
              lest::location::location(local_3ec8,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"!(d >= e1)",&local_4d61);
              std::__cxx11::string::string((string *)&local_48f0,local_4cf8);
              std::__cxx11::string::string((string *)&local_2c90,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)&local_4c78,local_3ec8,&local_48f0,&local_2c90,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_4cd8,lest_env);
              std::__cxx11::string::string((string *)&local_2b0,(string *)&local_4cd8);
              lest::report(poVar1,&local_4c78,&local_2b0);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              lest::message::~message(&local_4c78);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
            }
            std::__cxx11::string::_M_dispose();
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar5 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<int,_int,_int>::id1356 = iVar6 + -1;
        iVar6 = iVar6 + 1;
      }
      if (relop<int,_int,_int>::id1356 == iVar3) {
        uVar5 = 1;
        uVar2 = 0;
        while (uVar2 < uVar5) {
          std::__cxx11::string::string
                    ((string *)&local_4c78,"disengaged == nullopt",(allocator *)&score);
          std::__cxx11::string::string((string *)local_ff0,(string *)&local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,local_ff0);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          while (bVar7 = lest__ctx_section.once != false, lest__ctx_section.once = false, bVar7) {
            local_4d18[0]._0_4_ = CONCAT31(local_4d18[0]._1_3_,d.has_value_) ^ 1;
            local_4cb8.file._M_dataplus._M_p = &local_4d18[0].has_value_;
            lest::expression_lhs::operator_cast_to_result
                      ((result *)&local_4c78,(expression_lhs *)&local_4cb8);
            lest::result::result(&score,(result *)&local_4c78);
            std::__cxx11::string::_M_dispose();
            if (score.passed == false) {
              pfVar4 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,(allocator *)&local_4cd8);
              std::__cxx11::string::string(local_1010,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_1010);
              local_4cb8.line = 0x54c;
              lest::location::location(&local_1f18,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"(d == nullopt)",&local_4d62);
              std::__cxx11::string::string((string *)local_2cd0,local_4cf8);
              std::__cxx11::string::string((string *)&local_1030,(string *)&score.decomposition);
              lest::failure::failure((failure *)&local_4c78,&local_1f18,local_2cd0,&local_1030);
              lest::failure::failure(pfVar4,(failure *)&local_4c78);
              __cxa_throw(pfVar4,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,&local_4d62);
              std::__cxx11::string::string(local_2cf0,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_2cf0);
              local_4cb8.line = 0x54c;
              lest::location::location(local_3f18,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"(d == nullopt)",&local_4d61);
              std::__cxx11::string::string((string *)&local_4910,local_4cf8);
              std::__cxx11::string::string((string *)&local_2d10,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)&local_4c78,local_3f18,&local_4910,&local_2d10,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_4cd8,lest_env);
              std::__cxx11::string::string((string *)&local_2d0,(string *)&local_4cd8);
              lest::report(poVar1,&local_4c78,&local_2d0);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              lest::message::~message(&local_4c78);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
            }
            std::__cxx11::string::_M_dispose();
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar5 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<int,_int,_int>::id1357 = iVar6 + -1;
        iVar6 = iVar6 + 1;
      }
      if (relop<int,_int,_int>::id1357 == iVar3) {
        uVar5 = 1;
        uVar2 = 0;
        while (uVar2 < uVar5) {
          std::__cxx11::string::string
                    ((string *)&local_4c78,"nullopt    == disengaged",(allocator *)&score);
          std::__cxx11::string::string((string *)local_1070,(string *)&local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,local_1070);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          while (bVar7 = lest__ctx_section.once != false, lest__ctx_section.once = false, bVar7) {
            local_4d18[0]._0_4_ = CONCAT31(local_4d18[0]._1_3_,d.has_value_) ^ 1;
            local_4cb8.file._M_dataplus._M_p = &local_4d18[0].has_value_;
            lest::expression_lhs::operator_cast_to_result
                      ((result *)&local_4c78,(expression_lhs *)&local_4cb8);
            lest::result::result(&score,(result *)&local_4c78);
            std::__cxx11::string::_M_dispose();
            if (score.passed == false) {
              pfVar4 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,(allocator *)&local_4cd8);
              std::__cxx11::string::string(local_1090,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_1090);
              local_4cb8.line = 0x54d;
              lest::location::location(&local_1f40,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"(nullopt == d )",&local_4d62);
              std::__cxx11::string::string((string *)local_2d50,local_4cf8);
              std::__cxx11::string::string((string *)&local_10b0,(string *)&score.decomposition);
              lest::failure::failure((failure *)&local_4c78,&local_1f40,local_2d50,&local_10b0);
              lest::failure::failure(pfVar4,(failure *)&local_4c78);
              __cxa_throw(pfVar4,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,&local_4d62);
              std::__cxx11::string::string(local_2d70,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_2d70);
              local_4cb8.line = 0x54d;
              lest::location::location(local_3f68,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"(nullopt == d )",&local_4d61);
              std::__cxx11::string::string((string *)&local_4930,local_4cf8);
              std::__cxx11::string::string((string *)&local_2d90,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)&local_4c78,local_3f68,&local_4930,&local_2d90,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_4cd8,lest_env);
              std::__cxx11::string::string((string *)&local_2f0,(string *)&local_4cd8);
              lest::report(poVar1,&local_4c78,&local_2f0);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              lest::message::~message(&local_4c78);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
            }
            std::__cxx11::string::_M_dispose();
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar5 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<int,_int,_int>::id1358 = iVar6 + -1;
        iVar6 = iVar6 + 1;
      }
      if (relop<int,_int,_int>::id1358 == iVar3) {
        uVar5 = 1;
        uVar2 = 0;
        while (uVar2 < uVar5) {
          std::__cxx11::string::string
                    ((string *)&local_4c78,"engaged    == nullopt",(allocator *)&score);
          std::__cxx11::string::string((string *)local_10f0,(string *)&local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,local_10f0);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          while (bVar7 = lest__ctx_section.once != false, lest__ctx_section.once = false, bVar7) {
            local_4d18[0].has_value_ = e1.has_value_;
            local_4cb8.file._M_dataplus._M_p = &local_4d18[0].has_value_;
            lest::expression_lhs::operator_cast_to_result
                      ((result *)&local_4c78,(expression_lhs *)&local_4cb8);
            lest::result::result(&score,(result *)&local_4c78);
            std::__cxx11::string::_M_dispose();
            if (score.passed == false) {
              pfVar4 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,(allocator *)&local_4cd8);
              std::__cxx11::string::string(local_1110,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_1110);
              local_4cb8.line = 0x54e;
              lest::location::location(&local_1f68,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"(e1 != nullopt)",&local_4d62);
              std::__cxx11::string::string((string *)local_2dd0,local_4cf8);
              std::__cxx11::string::string((string *)&local_1130,(string *)&score.decomposition);
              lest::failure::failure((failure *)&local_4c78,&local_1f68,local_2dd0,&local_1130);
              lest::failure::failure(pfVar4,(failure *)&local_4c78);
              __cxa_throw(pfVar4,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,&local_4d62);
              std::__cxx11::string::string(local_2df0,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_2df0);
              local_4cb8.line = 0x54e;
              lest::location::location(local_3fb8,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"(e1 != nullopt)",&local_4d61);
              std::__cxx11::string::string((string *)&local_4950,local_4cf8);
              std::__cxx11::string::string((string *)&local_2e10,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)&local_4c78,local_3fb8,&local_4950,&local_2e10,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_4cd8,lest_env);
              std::__cxx11::string::string((string *)&local_310,(string *)&local_4cd8);
              lest::report(poVar1,&local_4c78,&local_310);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              lest::message::~message(&local_4c78);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
            }
            std::__cxx11::string::_M_dispose();
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar5 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<int,_int,_int>::id1359 = iVar6 + -1;
        iVar6 = iVar6 + 1;
      }
      if (relop<int,_int,_int>::id1359 == iVar3) {
        uVar5 = 1;
        uVar2 = 0;
        while (uVar2 < uVar5) {
          std::__cxx11::string::string
                    ((string *)&local_4c78,"nullopt    == engaged",(allocator *)&score);
          std::__cxx11::string::string((string *)local_1170,(string *)&local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,local_1170);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          while (bVar7 = lest__ctx_section.once != false, lest__ctx_section.once = false, bVar7) {
            local_4d18[0].has_value_ = e1.has_value_;
            local_4cb8.file._M_dataplus._M_p = &local_4d18[0].has_value_;
            lest::expression_lhs::operator_cast_to_result
                      ((result *)&local_4c78,(expression_lhs *)&local_4cb8);
            lest::result::result(&score,(result *)&local_4c78);
            std::__cxx11::string::_M_dispose();
            if (score.passed == false) {
              pfVar4 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,(allocator *)&local_4cd8);
              std::__cxx11::string::string(local_1190,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_1190);
              local_4cb8.line = 0x54f;
              lest::location::location(&local_1f90,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"(nullopt != e1 )",&local_4d62);
              std::__cxx11::string::string((string *)local_2e50,local_4cf8);
              std::__cxx11::string::string((string *)&local_11b0,(string *)&score.decomposition);
              lest::failure::failure((failure *)&local_4c78,&local_1f90,local_2e50,&local_11b0);
              lest::failure::failure(pfVar4,(failure *)&local_4c78);
              __cxa_throw(pfVar4,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,&local_4d62);
              std::__cxx11::string::string(local_2e70,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_2e70);
              local_4cb8.line = 0x54f;
              lest::location::location(local_4008,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"(nullopt != e1 )",&local_4d61);
              std::__cxx11::string::string((string *)&local_4970,local_4cf8);
              std::__cxx11::string::string((string *)&local_2e90,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)&local_4c78,local_4008,&local_4970,&local_2e90,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_4cd8,lest_env);
              std::__cxx11::string::string((string *)&local_330,(string *)&local_4cd8);
              lest::report(poVar1,&local_4c78,&local_330);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              lest::message::~message(&local_4c78);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
            }
            std::__cxx11::string::_M_dispose();
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar5 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<int,_int,_int>::id1360 = iVar6 + -1;
        iVar6 = iVar6 + 1;
      }
      if (relop<int,_int,_int>::id1360 == iVar3) {
        uVar5 = 1;
        uVar2 = 0;
        while (uVar2 < uVar5) {
          std::__cxx11::string::string
                    ((string *)&local_4c78,"disengaged == nullopt",(allocator *)&score);
          std::__cxx11::string::string((string *)local_11f0,(string *)&local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,local_11f0);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          while (bVar7 = lest__ctx_section.once != false, lest__ctx_section.once = false, bVar7) {
            local_4d18[0].has_value_ = true;
            local_4cb8.file._M_dataplus._M_p = &local_4d18[0].has_value_;
            lest::expression_lhs::operator_cast_to_result
                      ((result *)&local_4c78,(expression_lhs *)&local_4cb8);
            lest::result::result(&score,(result *)&local_4c78);
            std::__cxx11::string::_M_dispose();
            if (score.passed == false) {
              pfVar4 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,(allocator *)&local_4cd8);
              std::__cxx11::string::string(local_1210,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_1210);
              local_4cb8.line = 0x550;
              lest::location::location(&local_1fb8,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"!(d < nullopt)",&local_4d62);
              std::__cxx11::string::string((string *)local_2ed0,local_4cf8);
              std::__cxx11::string::string((string *)&local_1230,(string *)&score.decomposition);
              lest::failure::failure((failure *)&local_4c78,&local_1fb8,local_2ed0,&local_1230);
              lest::failure::failure(pfVar4,(failure *)&local_4c78);
              __cxa_throw(pfVar4,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,&local_4d62);
              std::__cxx11::string::string(local_2ef0,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_2ef0);
              local_4cb8.line = 0x550;
              lest::location::location(local_4058,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"!(d < nullopt)",&local_4d61);
              std::__cxx11::string::string((string *)&local_4990,local_4cf8);
              std::__cxx11::string::string((string *)&local_2f10,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)&local_4c78,local_4058,&local_4990,&local_2f10,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_4cd8,lest_env);
              std::__cxx11::string::string((string *)&local_350,(string *)&local_4cd8);
              lest::report(poVar1,&local_4c78,&local_350);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              lest::message::~message(&local_4c78);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
            }
            std::__cxx11::string::_M_dispose();
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar5 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<int,_int,_int>::id1361 = iVar6 + -1;
        iVar6 = iVar6 + 1;
      }
      if (relop<int,_int,_int>::id1361 == iVar3) {
        uVar5 = 1;
        uVar2 = 0;
        while (uVar2 < uVar5) {
          std::__cxx11::string::string
                    ((string *)&local_4c78,"nullopt    == disengaged",(allocator *)&score);
          std::__cxx11::string::string((string *)local_1270,(string *)&local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,local_1270);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          while (bVar7 = lest__ctx_section.once != false, lest__ctx_section.once = false, bVar7) {
            local_4d18[0]._0_4_ = CONCAT31(local_4d18[0]._1_3_,d.has_value_) ^ 1;
            local_4cb8.file._M_dataplus._M_p = &local_4d18[0].has_value_;
            lest::expression_lhs::operator_cast_to_result
                      ((result *)&local_4c78,(expression_lhs *)&local_4cb8);
            lest::result::result(&score,(result *)&local_4c78);
            std::__cxx11::string::_M_dispose();
            if (score.passed == false) {
              pfVar4 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,(allocator *)&local_4cd8);
              std::__cxx11::string::string(local_1290,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_1290);
              local_4cb8.line = 0x551;
              lest::location::location(&local_1fe0,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"!(nullopt < d )",&local_4d62);
              std::__cxx11::string::string((string *)local_2f50,local_4cf8);
              std::__cxx11::string::string((string *)&local_12b0,(string *)&score.decomposition);
              lest::failure::failure((failure *)&local_4c78,&local_1fe0,local_2f50,&local_12b0);
              lest::failure::failure(pfVar4,(failure *)&local_4c78);
              __cxa_throw(pfVar4,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,&local_4d62);
              std::__cxx11::string::string(local_2f70,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_2f70);
              local_4cb8.line = 0x551;
              lest::location::location(local_40a8,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"!(nullopt < d )",&local_4d61);
              std::__cxx11::string::string((string *)&local_49b0,local_4cf8);
              std::__cxx11::string::string((string *)&local_2f90,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)&local_4c78,local_40a8,&local_49b0,&local_2f90,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_4cd8,lest_env);
              std::__cxx11::string::string((string *)&local_370,(string *)&local_4cd8);
              lest::report(poVar1,&local_4c78,&local_370);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              lest::message::~message(&local_4c78);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
            }
            std::__cxx11::string::_M_dispose();
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar5 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<int,_int,_int>::id1362 = iVar6 + -1;
        iVar6 = iVar6 + 1;
      }
      if (relop<int,_int,_int>::id1362 == iVar3) {
        uVar5 = 1;
        uVar2 = 0;
        while (uVar2 < uVar5) {
          std::__cxx11::string::string
                    ((string *)&local_4c78,"disengaged == nullopt",(allocator *)&score);
          std::__cxx11::string::string((string *)local_12f0,(string *)&local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,local_12f0);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          while (bVar7 = lest__ctx_section.once != false, lest__ctx_section.once = false, bVar7) {
            local_4d18[0]._0_4_ = CONCAT31(local_4d18[0]._1_3_,d.has_value_) ^ 1;
            local_4cb8.file._M_dataplus._M_p = &local_4d18[0].has_value_;
            lest::expression_lhs::operator_cast_to_result
                      ((result *)&local_4c78,(expression_lhs *)&local_4cb8);
            lest::result::result(&score,(result *)&local_4c78);
            std::__cxx11::string::_M_dispose();
            if (score.passed == false) {
              pfVar4 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,(allocator *)&local_4cd8);
              std::__cxx11::string::string(local_1310,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_1310);
              local_4cb8.line = 0x552;
              lest::location::location(&local_2008,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"(d <= nullopt)",&local_4d62);
              std::__cxx11::string::string((string *)local_2fd0,local_4cf8);
              std::__cxx11::string::string((string *)&local_1330,(string *)&score.decomposition);
              lest::failure::failure((failure *)&local_4c78,&local_2008,local_2fd0,&local_1330);
              lest::failure::failure(pfVar4,(failure *)&local_4c78);
              __cxa_throw(pfVar4,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,&local_4d62);
              std::__cxx11::string::string(local_2ff0,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_2ff0);
              local_4cb8.line = 0x552;
              lest::location::location(local_40f8,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"(d <= nullopt)",&local_4d61);
              std::__cxx11::string::string((string *)&local_49d0,local_4cf8);
              std::__cxx11::string::string((string *)&local_3010,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)&local_4c78,local_40f8,&local_49d0,&local_3010,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_4cd8,lest_env);
              std::__cxx11::string::string((string *)&local_390,(string *)&local_4cd8);
              lest::report(poVar1,&local_4c78,&local_390);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              lest::message::~message(&local_4c78);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
            }
            std::__cxx11::string::_M_dispose();
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar5 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<int,_int,_int>::id1363 = iVar6 + -1;
        iVar6 = iVar6 + 1;
      }
      if (relop<int,_int,_int>::id1363 == iVar3) {
        uVar5 = 1;
        uVar2 = 0;
        while (uVar2 < uVar5) {
          std::__cxx11::string::string
                    ((string *)&local_4c78,"nullopt    == disengaged",(allocator *)&score);
          std::__cxx11::string::string((string *)local_1370,(string *)&local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,local_1370);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          while (bVar7 = lest__ctx_section.once != false, lest__ctx_section.once = false, bVar7) {
            local_4d18[0].has_value_ = true;
            local_4cb8.file._M_dataplus._M_p = &local_4d18[0].has_value_;
            lest::expression_lhs::operator_cast_to_result
                      ((result *)&local_4c78,(expression_lhs *)&local_4cb8);
            lest::result::result(&score,(result *)&local_4c78);
            std::__cxx11::string::_M_dispose();
            if (score.passed == false) {
              pfVar4 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,(allocator *)&local_4cd8);
              std::__cxx11::string::string(local_1390,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_1390);
              local_4cb8.line = 0x553;
              lest::location::location(&local_2030,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"(nullopt <= d )",&local_4d62);
              std::__cxx11::string::string((string *)local_3050,local_4cf8);
              std::__cxx11::string::string((string *)&local_13b0,(string *)&score.decomposition);
              lest::failure::failure((failure *)&local_4c78,&local_2030,local_3050,&local_13b0);
              lest::failure::failure(pfVar4,(failure *)&local_4c78);
              __cxa_throw(pfVar4,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,&local_4d62);
              std::__cxx11::string::string(local_3070,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_3070);
              local_4cb8.line = 0x553;
              lest::location::location(local_4148,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"(nullopt <= d )",&local_4d61);
              std::__cxx11::string::string((string *)&local_49f0,local_4cf8);
              std::__cxx11::string::string((string *)&local_3090,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)&local_4c78,local_4148,&local_49f0,&local_3090,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_4cd8,lest_env);
              std::__cxx11::string::string((string *)&local_3b0,(string *)&local_4cd8);
              lest::report(poVar1,&local_4c78,&local_3b0);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              lest::message::~message(&local_4c78);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
            }
            std::__cxx11::string::_M_dispose();
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar5 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<int,_int,_int>::id1364 = iVar6 + -1;
        iVar6 = iVar6 + 1;
      }
      if (relop<int,_int,_int>::id1364 == iVar3) {
        uVar5 = 1;
        uVar2 = 0;
        while (uVar2 < uVar5) {
          std::__cxx11::string::string
                    ((string *)&local_4c78,"disengaged == nullopt",(allocator *)&score);
          std::__cxx11::string::string((string *)local_13f0,(string *)&local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,local_13f0);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          while (bVar7 = lest__ctx_section.once != false, lest__ctx_section.once = false, bVar7) {
            local_4d18[0]._0_4_ = CONCAT31(local_4d18[0]._1_3_,d.has_value_) ^ 1;
            local_4cb8.file._M_dataplus._M_p = &local_4d18[0].has_value_;
            lest::expression_lhs::operator_cast_to_result
                      ((result *)&local_4c78,(expression_lhs *)&local_4cb8);
            lest::result::result(&score,(result *)&local_4c78);
            std::__cxx11::string::_M_dispose();
            if (score.passed == false) {
              pfVar4 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,(allocator *)&local_4cd8);
              std::__cxx11::string::string(local_1410,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_1410);
              local_4cb8.line = 0x554;
              lest::location::location(&local_2058,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"!(d > nullopt)",&local_4d62);
              std::__cxx11::string::string((string *)local_30d0,local_4cf8);
              std::__cxx11::string::string((string *)&local_1430,(string *)&score.decomposition);
              lest::failure::failure((failure *)&local_4c78,&local_2058,local_30d0,&local_1430);
              lest::failure::failure(pfVar4,(failure *)&local_4c78);
              __cxa_throw(pfVar4,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,&local_4d62);
              std::__cxx11::string::string(local_30f0,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_30f0);
              local_4cb8.line = 0x554;
              lest::location::location(local_4198,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"!(d > nullopt)",&local_4d61);
              std::__cxx11::string::string((string *)&local_4a10,local_4cf8);
              std::__cxx11::string::string((string *)&local_3110,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)&local_4c78,local_4198,&local_4a10,&local_3110,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_4cd8,lest_env);
              std::__cxx11::string::string((string *)&local_3d0,(string *)&local_4cd8);
              lest::report(poVar1,&local_4c78,&local_3d0);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              lest::message::~message(&local_4c78);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
            }
            std::__cxx11::string::_M_dispose();
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar5 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<int,_int,_int>::id1365 = iVar6 + -1;
        iVar6 = iVar6 + 1;
      }
      if (relop<int,_int,_int>::id1365 == iVar3) {
        uVar5 = 1;
        uVar2 = 0;
        while (uVar2 < uVar5) {
          std::__cxx11::string::string
                    ((string *)&local_4c78,"nullopt    == disengaged",(allocator *)&score);
          std::__cxx11::string::string((string *)local_1470,(string *)&local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,local_1470);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          while (bVar7 = lest__ctx_section.once != false, lest__ctx_section.once = false, bVar7) {
            local_4d18[0].has_value_ = true;
            local_4cb8.file._M_dataplus._M_p = &local_4d18[0].has_value_;
            lest::expression_lhs::operator_cast_to_result
                      ((result *)&local_4c78,(expression_lhs *)&local_4cb8);
            lest::result::result(&score,(result *)&local_4c78);
            std::__cxx11::string::_M_dispose();
            if (score.passed == false) {
              pfVar4 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,(allocator *)&local_4cd8);
              std::__cxx11::string::string(local_1490,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_1490);
              local_4cb8.line = 0x555;
              lest::location::location(&local_2080,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"!(nullopt > d )",&local_4d62);
              std::__cxx11::string::string((string *)local_3150,local_4cf8);
              std::__cxx11::string::string((string *)&local_14b0,(string *)&score.decomposition);
              lest::failure::failure((failure *)&local_4c78,&local_2080,local_3150,&local_14b0);
              lest::failure::failure(pfVar4,(failure *)&local_4c78);
              __cxa_throw(pfVar4,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,&local_4d62);
              std::__cxx11::string::string(local_3170,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_3170);
              local_4cb8.line = 0x555;
              lest::location::location(local_41e8,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"!(nullopt > d )",&local_4d61);
              std::__cxx11::string::string((string *)&local_4a30,local_4cf8);
              std::__cxx11::string::string((string *)&local_3190,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)&local_4c78,local_41e8,&local_4a30,&local_3190,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_4cd8,lest_env);
              std::__cxx11::string::string((string *)&local_3f0,(string *)&local_4cd8);
              lest::report(poVar1,&local_4c78,&local_3f0);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              lest::message::~message(&local_4c78);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
            }
            std::__cxx11::string::_M_dispose();
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar5 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<int,_int,_int>::id1366 = iVar6 + -1;
        iVar6 = iVar6 + 1;
      }
      if (relop<int,_int,_int>::id1366 == iVar3) {
        uVar5 = 1;
        uVar2 = 0;
        while (uVar2 < uVar5) {
          std::__cxx11::string::string
                    ((string *)&local_4c78,"disengaged == nullopt",(allocator *)&score);
          std::__cxx11::string::string((string *)local_14f0,(string *)&local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,local_14f0);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          while (bVar7 = lest__ctx_section.once != false, lest__ctx_section.once = false, bVar7) {
            local_4d18[0].has_value_ = true;
            local_4cb8.file._M_dataplus._M_p = &local_4d18[0].has_value_;
            lest::expression_lhs::operator_cast_to_result
                      ((result *)&local_4c78,(expression_lhs *)&local_4cb8);
            lest::result::result(&score,(result *)&local_4c78);
            std::__cxx11::string::_M_dispose();
            if (score.passed == false) {
              pfVar4 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,(allocator *)&local_4cd8);
              std::__cxx11::string::string(local_1510,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_1510);
              local_4cb8.line = 0x556;
              lest::location::location(&local_20a8,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"(d >= nullopt)",&local_4d62);
              std::__cxx11::string::string((string *)local_31d0,local_4cf8);
              std::__cxx11::string::string((string *)&local_1530,(string *)&score.decomposition);
              lest::failure::failure((failure *)&local_4c78,&local_20a8,local_31d0,&local_1530);
              lest::failure::failure(pfVar4,(failure *)&local_4c78);
              __cxa_throw(pfVar4,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,&local_4d62);
              std::__cxx11::string::string(local_31f0,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_31f0);
              local_4cb8.line = 0x556;
              lest::location::location(local_4238,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"(d >= nullopt)",&local_4d61);
              std::__cxx11::string::string((string *)&local_4a50,local_4cf8);
              std::__cxx11::string::string((string *)&local_3210,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)&local_4c78,local_4238,&local_4a50,&local_3210,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_4cd8,lest_env);
              std::__cxx11::string::string((string *)&local_410,(string *)&local_4cd8);
              lest::report(poVar1,&local_4c78,&local_410);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              lest::message::~message(&local_4c78);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
            }
            std::__cxx11::string::_M_dispose();
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar5 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<int,_int,_int>::id1367 = iVar6 + -1;
        iVar6 = iVar6 + 1;
      }
      if (relop<int,_int,_int>::id1367 == iVar3) {
        uVar5 = 1;
        uVar2 = 0;
        while (uVar2 < uVar5) {
          std::__cxx11::string::string
                    ((string *)&local_4c78,"nullopt    == disengaged",(allocator *)&score);
          std::__cxx11::string::string((string *)local_1570,(string *)&local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,local_1570);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          while (bVar7 = lest__ctx_section.once != false, lest__ctx_section.once = false, bVar7) {
            local_4d18[0]._0_4_ = CONCAT31(local_4d18[0]._1_3_,d.has_value_) ^ 1;
            local_4cb8.file._M_dataplus._M_p = &local_4d18[0].has_value_;
            lest::expression_lhs::operator_cast_to_result
                      ((result *)&local_4c78,(expression_lhs *)&local_4cb8);
            lest::result::result(&score,(result *)&local_4c78);
            std::__cxx11::string::_M_dispose();
            if (score.passed == false) {
              pfVar4 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,(allocator *)&local_4cd8);
              std::__cxx11::string::string(local_1590,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_1590);
              local_4cb8.line = 0x557;
              lest::location::location(&local_20d0,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"(nullopt >= d )",&local_4d62);
              std::__cxx11::string::string((string *)local_3250,local_4cf8);
              std::__cxx11::string::string((string *)&local_15b0,(string *)&score.decomposition);
              lest::failure::failure((failure *)&local_4c78,&local_20d0,local_3250,&local_15b0);
              lest::failure::failure(pfVar4,(failure *)&local_4c78);
              __cxa_throw(pfVar4,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,&local_4d62);
              std::__cxx11::string::string(local_3270,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_3270);
              local_4cb8.line = 0x557;
              lest::location::location(local_4288,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"(nullopt >= d )",&local_4d61);
              std::__cxx11::string::string((string *)&local_4a70,local_4cf8);
              std::__cxx11::string::string((string *)&local_3290,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)&local_4c78,local_4288,&local_4a70,&local_3290,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_4cd8,lest_env);
              std::__cxx11::string::string((string *)&local_430,(string *)&local_4cd8);
              lest::report(poVar1,&local_4c78,&local_430);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              lest::message::~message(&local_4c78);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
            }
            std::__cxx11::string::_M_dispose();
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar5 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<int,_int,_int>::id1369 = iVar6 + -1;
        iVar6 = iVar6 + 1;
      }
      if (relop<int,_int,_int>::id1369 == iVar3) {
        uVar5 = 1;
        uVar2 = 0;
        while (uVar2 < uVar5) {
          std::__cxx11::string::string
                    ((string *)&local_4c78,"engaged    == value",(allocator *)&score);
          std::__cxx11::string::string((string *)local_15f0,(string *)&local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,local_15f0);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          while (bVar7 = lest__ctx_section.once != false, lest__ctx_section.once = false, bVar7) {
            local_4cb8.file._M_dataplus._M_p = &e1.has_value_;
            local_4d18[0]._0_4_ = 6;
            lest::expression_lhs<nonstd::optional_lite::optional<int>const&>::operator==
                      ((result *)&local_4c78,
                       (expression_lhs<nonstd::optional_lite::optional<int>const&> *)&local_4cb8,
                       (int *)local_4d18);
            lest::result::result(&score,(result *)&local_4c78);
            std::__cxx11::string::_M_dispose();
            if (score.passed == false) {
              pfVar4 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,(allocator *)&local_4cd8);
              std::__cxx11::string::string(local_1610,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_1610);
              local_4cb8.line = 0x559;
              lest::location::location(&local_20f8,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"e1 == 6",&local_4d62);
              std::__cxx11::string::string((string *)local_32d0,local_4cf8);
              std::__cxx11::string::string((string *)&local_1630,(string *)&score.decomposition);
              lest::failure::failure((failure *)&local_4c78,&local_20f8,local_32d0,&local_1630);
              lest::failure::failure(pfVar4,(failure *)&local_4c78);
              __cxa_throw(pfVar4,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,&local_4d62);
              std::__cxx11::string::string(local_32f0,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_32f0);
              local_4cb8.line = 0x559;
              lest::location::location(local_42d8,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"e1 == 6",&local_4d61);
              std::__cxx11::string::string((string *)&local_4a90,local_4cf8);
              std::__cxx11::string::string((string *)&local_3310,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)&local_4c78,local_42d8,&local_4a90,&local_3310,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_4cd8,lest_env);
              std::__cxx11::string::string((string *)&local_450,(string *)&local_4cd8);
              lest::report(poVar1,&local_4c78,&local_450);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              lest::message::~message(&local_4c78);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
            }
            std::__cxx11::string::_M_dispose();
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar5 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<int,_int,_int>::id1370 = iVar6 + -1;
        iVar6 = iVar6 + 1;
      }
      if (relop<int,_int,_int>::id1370 == iVar3) {
        uVar5 = 1;
        uVar2 = 0;
        while (uVar2 < uVar5) {
          std::__cxx11::string::string
                    ((string *)&local_4c78,"value     == engaged",(allocator *)&score);
          std::__cxx11::string::string((string *)local_1670,(string *)&local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,local_1670);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          while (bVar7 = lest__ctx_section.once != false, lest__ctx_section.once = false, bVar7) {
            local_4d18[0]._0_4_ = 6;
            local_4cb8.file._M_dataplus._M_p = &local_4d18[0].has_value_;
            lest::expression_lhs<int_const&>::operator==
                      ((result *)&local_4c78,(expression_lhs<int_const&> *)&local_4cb8,&e1);
            lest::result::result(&score,(result *)&local_4c78);
            std::__cxx11::string::_M_dispose();
            if (score.passed == false) {
              pfVar4 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,(allocator *)&local_4cd8);
              std::__cxx11::string::string(local_1690,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_1690);
              local_4cb8.line = 0x55a;
              lest::location::location(&local_2120,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"6 == e1",&local_4d62);
              std::__cxx11::string::string((string *)local_3350,local_4cf8);
              std::__cxx11::string::string((string *)&local_16b0,(string *)&score.decomposition);
              lest::failure::failure((failure *)&local_4c78,&local_2120,local_3350,&local_16b0);
              lest::failure::failure(pfVar4,(failure *)&local_4c78);
              __cxa_throw(pfVar4,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,&local_4d62);
              std::__cxx11::string::string(local_3370,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_3370);
              local_4cb8.line = 0x55a;
              lest::location::location(local_4328,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"6 == e1",&local_4d61);
              std::__cxx11::string::string((string *)&local_4ab0,local_4cf8);
              std::__cxx11::string::string((string *)&local_3390,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)&local_4c78,local_4328,&local_4ab0,&local_3390,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_4cd8,lest_env);
              std::__cxx11::string::string((string *)&local_470,(string *)&local_4cd8);
              lest::report(poVar1,&local_4c78,&local_470);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              lest::message::~message(&local_4c78);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
            }
            std::__cxx11::string::_M_dispose();
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar5 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<int,_int,_int>::id1371 = iVar6 + -1;
        iVar6 = iVar6 + 1;
      }
      if (relop<int,_int,_int>::id1371 == iVar3) {
        uVar5 = 1;
        uVar2 = 0;
        while (uVar2 < uVar5) {
          std::__cxx11::string::string
                    ((string *)&local_4c78,"engaged   != value",(allocator *)&score);
          std::__cxx11::string::string((string *)local_16f0,(string *)&local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,local_16f0);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          while (bVar7 = lest__ctx_section.once != false, lest__ctx_section.once = false, bVar7) {
            local_4cb8.file._M_dataplus._M_p = &e1.has_value_;
            local_4d18[0]._0_4_ = 7;
            lest::expression_lhs<nonstd::optional_lite::optional<int>const&>::operator!=
                      ((result *)&local_4c78,
                       (expression_lhs<nonstd::optional_lite::optional<int>const&> *)&local_4cb8,
                       (int *)local_4d18);
            lest::result::result(&score,(result *)&local_4c78);
            std::__cxx11::string::_M_dispose();
            if (score.passed == false) {
              pfVar4 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,(allocator *)&local_4cd8);
              std::__cxx11::string::string(local_1710,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_1710);
              local_4cb8.line = 0x55b;
              lest::location::location(&local_2148,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"e1 != 7",&local_4d62);
              std::__cxx11::string::string((string *)local_33d0,local_4cf8);
              std::__cxx11::string::string((string *)&local_1730,(string *)&score.decomposition);
              lest::failure::failure((failure *)&local_4c78,&local_2148,local_33d0,&local_1730);
              lest::failure::failure(pfVar4,(failure *)&local_4c78);
              __cxa_throw(pfVar4,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,&local_4d62);
              std::__cxx11::string::string(local_33f0,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_33f0);
              local_4cb8.line = 0x55b;
              lest::location::location(local_4378,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"e1 != 7",&local_4d61);
              std::__cxx11::string::string((string *)&local_4ad0,local_4cf8);
              std::__cxx11::string::string((string *)&local_3410,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)&local_4c78,local_4378,&local_4ad0,&local_3410,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_4cd8,lest_env);
              std::__cxx11::string::string((string *)&local_490,(string *)&local_4cd8);
              lest::report(poVar1,&local_4c78,&local_490);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              lest::message::~message(&local_4c78);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
            }
            std::__cxx11::string::_M_dispose();
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar5 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<int,_int,_int>::id1372 = iVar6 + -1;
        iVar6 = iVar6 + 1;
      }
      if (relop<int,_int,_int>::id1372 == iVar3) {
        uVar5 = 1;
        uVar2 = 0;
        while (uVar2 < uVar5) {
          std::__cxx11::string::string
                    ((string *)&local_4c78,"value     != engaged",(allocator *)&score);
          std::__cxx11::string::string((string *)local_1770,(string *)&local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,local_1770);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          while (bVar7 = lest__ctx_section.once != false, lest__ctx_section.once = false, bVar7) {
            local_4d18[0]._0_4_ = 6;
            local_4cb8.file._M_dataplus._M_p = &local_4d18[0].has_value_;
            lest::expression_lhs<int_const&>::operator!=
                      ((result *)&local_4c78,(expression_lhs<int_const&> *)&local_4cb8,&e2);
            lest::result::result(&score,(result *)&local_4c78);
            std::__cxx11::string::_M_dispose();
            if (score.passed == false) {
              pfVar4 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,(allocator *)&local_4cd8);
              std::__cxx11::string::string(local_1790,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_1790);
              local_4cb8.line = 0x55c;
              lest::location::location(&local_2170,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"6 != e2",&local_4d62);
              std::__cxx11::string::string((string *)local_3450,local_4cf8);
              std::__cxx11::string::string((string *)&local_17b0,(string *)&score.decomposition);
              lest::failure::failure((failure *)&local_4c78,&local_2170,local_3450,&local_17b0);
              lest::failure::failure(pfVar4,(failure *)&local_4c78);
              __cxa_throw(pfVar4,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,&local_4d62);
              std::__cxx11::string::string(local_3470,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_3470);
              local_4cb8.line = 0x55c;
              lest::location::location(local_43c8,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"6 != e2",&local_4d61);
              std::__cxx11::string::string((string *)&local_4af0,local_4cf8);
              std::__cxx11::string::string((string *)&local_3490,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)&local_4c78,local_43c8,&local_4af0,&local_3490,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_4cd8,lest_env);
              std::__cxx11::string::string((string *)&local_4b0,(string *)&local_4cd8);
              lest::report(poVar1,&local_4c78,&local_4b0);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              lest::message::~message(&local_4c78);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
            }
            std::__cxx11::string::_M_dispose();
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar5 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<int,_int,_int>::id1373 = iVar6 + -1;
        iVar6 = iVar6 + 1;
      }
      if (relop<int,_int,_int>::id1373 == iVar3) {
        uVar5 = 1;
        uVar2 = 0;
        while (uVar2 < uVar5) {
          std::__cxx11::string::string
                    ((string *)&local_4c78,"engaged   <  value",(allocator *)&score);
          std::__cxx11::string::string((string *)local_17f0,(string *)&local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,local_17f0);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          while (bVar7 = lest__ctx_section.once != false, lest__ctx_section.once = false, bVar7) {
            local_4cb8.file._M_dataplus._M_p = &e1.has_value_;
            local_4d18[0]._0_4_ = 7;
            lest::expression_lhs<nonstd::optional_lite::optional<int>const&>::operator<
                      ((result *)&local_4c78,
                       (expression_lhs<nonstd::optional_lite::optional<int>const&> *)&local_4cb8,
                       (int *)local_4d18);
            lest::result::result(&score,(result *)&local_4c78);
            std::__cxx11::string::_M_dispose();
            if (score.passed == false) {
              pfVar4 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,(allocator *)&local_4cd8);
              std::__cxx11::string::string(local_1810,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_1810);
              local_4cb8.line = 0x55d;
              lest::location::location(&local_2198,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"e1 < 7",&local_4d62);
              std::__cxx11::string::string((string *)local_34d0,local_4cf8);
              std::__cxx11::string::string((string *)&local_1830,(string *)&score.decomposition);
              lest::failure::failure((failure *)&local_4c78,&local_2198,local_34d0,&local_1830);
              lest::failure::failure(pfVar4,(failure *)&local_4c78);
              __cxa_throw(pfVar4,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,&local_4d62);
              std::__cxx11::string::string(local_34f0,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_34f0);
              local_4cb8.line = 0x55d;
              lest::location::location(local_4418,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"e1 < 7",&local_4d61);
              std::__cxx11::string::string((string *)&local_4b10,local_4cf8);
              std::__cxx11::string::string((string *)&local_3510,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)&local_4c78,local_4418,&local_4b10,&local_3510,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_4cd8,lest_env);
              std::__cxx11::string::string((string *)&local_4d0,(string *)&local_4cd8);
              lest::report(poVar1,&local_4c78,&local_4d0);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              lest::message::~message(&local_4c78);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
            }
            std::__cxx11::string::_M_dispose();
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar5 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<int,_int,_int>::id1374 = iVar6 + -1;
        iVar6 = iVar6 + 1;
      }
      if (relop<int,_int,_int>::id1374 == iVar3) {
        uVar5 = 1;
        uVar2 = 0;
        while (uVar2 < uVar5) {
          std::__cxx11::string::string
                    ((string *)&local_4c78,"value     <  engaged",(allocator *)&score);
          std::__cxx11::string::string((string *)local_1870,(string *)&local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,local_1870);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          while (bVar7 = lest__ctx_section.once != false, lest__ctx_section.once = false, bVar7) {
            local_4d18[0]._0_4_ = 6;
            local_4cb8.file._M_dataplus._M_p = &local_4d18[0].has_value_;
            lest::expression_lhs<int_const&>::operator<
                      ((result *)&local_4c78,(expression_lhs<int_const&> *)&local_4cb8,&e2);
            lest::result::result(&score,(result *)&local_4c78);
            std::__cxx11::string::_M_dispose();
            if (score.passed == false) {
              pfVar4 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,(allocator *)&local_4cd8);
              std::__cxx11::string::string(local_1890,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_1890);
              local_4cb8.line = 0x55e;
              lest::location::location(&local_21c0,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"6 < e2",&local_4d62);
              std::__cxx11::string::string((string *)local_3550,local_4cf8);
              std::__cxx11::string::string((string *)&local_18b0,(string *)&score.decomposition);
              lest::failure::failure((failure *)&local_4c78,&local_21c0,local_3550,&local_18b0);
              lest::failure::failure(pfVar4,(failure *)&local_4c78);
              __cxa_throw(pfVar4,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,&local_4d62);
              std::__cxx11::string::string(local_3570,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_3570);
              local_4cb8.line = 0x55e;
              lest::location::location(local_4468,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"6 < e2",&local_4d61);
              std::__cxx11::string::string((string *)&local_4b30,local_4cf8);
              std::__cxx11::string::string((string *)&local_3590,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)&local_4c78,local_4468,&local_4b30,&local_3590,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_4cd8,lest_env);
              std::__cxx11::string::string((string *)&local_4f0,(string *)&local_4cd8);
              lest::report(poVar1,&local_4c78,&local_4f0);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              lest::message::~message(&local_4c78);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
            }
            std::__cxx11::string::_M_dispose();
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar5 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<int,_int,_int>::id1375 = iVar6 + -1;
        iVar6 = iVar6 + 1;
      }
      if (relop<int,_int,_int>::id1375 == iVar3) {
        uVar5 = 1;
        uVar2 = 0;
        while (uVar2 < uVar5) {
          std::__cxx11::string::string
                    ((string *)&local_4c78,"engaged   <= value",(allocator *)&score);
          std::__cxx11::string::string((string *)local_18f0,(string *)&local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,local_18f0);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          while (bVar7 = lest__ctx_section.once != false, lest__ctx_section.once = false, bVar7) {
            local_4cb8.file._M_dataplus._M_p = &e1.has_value_;
            local_4d18[0]._0_4_ = 7;
            lest::expression_lhs<nonstd::optional_lite::optional<int>const&>::operator<=
                      ((result *)&local_4c78,
                       (expression_lhs<nonstd::optional_lite::optional<int>const&> *)&local_4cb8,
                       (int *)local_4d18);
            lest::result::result(&score,(result *)&local_4c78);
            std::__cxx11::string::_M_dispose();
            if (score.passed == false) {
              pfVar4 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,(allocator *)&local_4cd8);
              std::__cxx11::string::string(local_1910,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_1910);
              local_4cb8.line = 0x55f;
              lest::location::location(&local_21e8,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"e1 <= 7",&local_4d62);
              std::__cxx11::string::string((string *)local_35d0,local_4cf8);
              std::__cxx11::string::string((string *)&local_1930,(string *)&score.decomposition);
              lest::failure::failure((failure *)&local_4c78,&local_21e8,local_35d0,&local_1930);
              lest::failure::failure(pfVar4,(failure *)&local_4c78);
              __cxa_throw(pfVar4,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,&local_4d62);
              std::__cxx11::string::string(local_35f0,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_35f0);
              local_4cb8.line = 0x55f;
              lest::location::location(local_44b8,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"e1 <= 7",&local_4d61);
              std::__cxx11::string::string((string *)&local_4b50,local_4cf8);
              std::__cxx11::string::string((string *)&local_3610,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)&local_4c78,local_44b8,&local_4b50,&local_3610,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_4cd8,lest_env);
              std::__cxx11::string::string((string *)&local_510,(string *)&local_4cd8);
              lest::report(poVar1,&local_4c78,&local_510);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              lest::message::~message(&local_4c78);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
            }
            std::__cxx11::string::_M_dispose();
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar5 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<int,_int,_int>::id1376 = iVar6 + -1;
        iVar6 = iVar6 + 1;
      }
      if (relop<int,_int,_int>::id1376 == iVar3) {
        uVar5 = 1;
        uVar2 = 0;
        while (uVar2 < uVar5) {
          std::__cxx11::string::string
                    ((string *)&local_4c78,"value     <= engaged",(allocator *)&score);
          std::__cxx11::string::string((string *)local_1970,(string *)&local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,local_1970);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          while (bVar7 = lest__ctx_section.once != false, lest__ctx_section.once = false, bVar7) {
            local_4d18[0]._0_4_ = 6;
            local_4cb8.file._M_dataplus._M_p = &local_4d18[0].has_value_;
            lest::expression_lhs<int_const&>::operator<=
                      ((result *)&local_4c78,(expression_lhs<int_const&> *)&local_4cb8,&e2);
            lest::result::result(&score,(result *)&local_4c78);
            std::__cxx11::string::_M_dispose();
            if (score.passed == false) {
              pfVar4 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,(allocator *)&local_4cd8);
              std::__cxx11::string::string(local_1990,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_1990);
              local_4cb8.line = 0x560;
              lest::location::location(&local_2210,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"6 <= e2",&local_4d62);
              std::__cxx11::string::string((string *)local_3650,local_4cf8);
              std::__cxx11::string::string((string *)&local_19b0,(string *)&score.decomposition);
              lest::failure::failure((failure *)&local_4c78,&local_2210,local_3650,&local_19b0);
              lest::failure::failure(pfVar4,(failure *)&local_4c78);
              __cxa_throw(pfVar4,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,&local_4d62);
              std::__cxx11::string::string(local_3670,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_3670);
              local_4cb8.line = 0x560;
              lest::location::location(local_4508,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"6 <= e2",&local_4d61);
              std::__cxx11::string::string((string *)&local_4b70,local_4cf8);
              std::__cxx11::string::string((string *)&local_3690,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)&local_4c78,local_4508,&local_4b70,&local_3690,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_4cd8,lest_env);
              std::__cxx11::string::string((string *)&local_530,(string *)&local_4cd8);
              lest::report(poVar1,&local_4c78,&local_530);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              lest::message::~message(&local_4c78);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
            }
            std::__cxx11::string::_M_dispose();
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar5 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<int,_int,_int>::id1377 = iVar6 + -1;
        iVar6 = iVar6 + 1;
      }
      if (relop<int,_int,_int>::id1377 == iVar3) {
        uVar5 = 1;
        uVar2 = 0;
        while (uVar2 < uVar5) {
          std::__cxx11::string::string
                    ((string *)&local_4c78,"engaged   >  value",(allocator *)&score);
          std::__cxx11::string::string((string *)local_19f0,(string *)&local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,local_19f0);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          while (bVar7 = lest__ctx_section.once != false, lest__ctx_section.once = false, bVar7) {
            local_4cb8.file._M_dataplus._M_p = &e2.has_value_;
            local_4d18[0]._0_4_ = 6;
            lest::expression_lhs<nonstd::optional_lite::optional<int>const&>::operator>
                      ((result *)&local_4c78,
                       (expression_lhs<nonstd::optional_lite::optional<int>const&> *)&local_4cb8,
                       (int *)local_4d18);
            lest::result::result(&score,(result *)&local_4c78);
            std::__cxx11::string::_M_dispose();
            if (score.passed == false) {
              pfVar4 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,(allocator *)&local_4cd8);
              std::__cxx11::string::string(local_1a10,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_1a10);
              local_4cb8.line = 0x561;
              lest::location::location(&local_2238,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"e2 > 6",&local_4d62);
              std::__cxx11::string::string((string *)local_36d0,local_4cf8);
              std::__cxx11::string::string((string *)&local_1a30,(string *)&score.decomposition);
              lest::failure::failure((failure *)&local_4c78,&local_2238,local_36d0,&local_1a30);
              lest::failure::failure(pfVar4,(failure *)&local_4c78);
              __cxa_throw(pfVar4,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,&local_4d62);
              std::__cxx11::string::string(local_36f0,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_36f0);
              local_4cb8.line = 0x561;
              lest::location::location(local_4558,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"e2 > 6",&local_4d61);
              std::__cxx11::string::string((string *)&local_4b90,local_4cf8);
              std::__cxx11::string::string((string *)&local_3710,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)&local_4c78,local_4558,&local_4b90,&local_3710,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_4cd8,lest_env);
              std::__cxx11::string::string((string *)&local_550,(string *)&local_4cd8);
              lest::report(poVar1,&local_4c78,&local_550);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              lest::message::~message(&local_4c78);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
            }
            std::__cxx11::string::_M_dispose();
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar5 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<int,_int,_int>::id1378 = iVar6 + -1;
        iVar6 = iVar6 + 1;
      }
      if (relop<int,_int,_int>::id1378 == iVar3) {
        uVar5 = 1;
        uVar2 = 0;
        while (uVar2 < uVar5) {
          std::__cxx11::string::string
                    ((string *)&local_4c78,"value     >  engaged",(allocator *)&score);
          std::__cxx11::string::string((string *)local_1a70,(string *)&local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,local_1a70);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          while (bVar7 = lest__ctx_section.once != false, lest__ctx_section.once = false, bVar7) {
            local_4d18[0]._0_4_ = 7;
            local_4cb8.file._M_dataplus._M_p = &local_4d18[0].has_value_;
            lest::expression_lhs<int_const&>::operator>
                      ((result *)&local_4c78,(expression_lhs<int_const&> *)&local_4cb8,&e1);
            lest::result::result(&score,(result *)&local_4c78);
            std::__cxx11::string::_M_dispose();
            if (score.passed == false) {
              pfVar4 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,(allocator *)&local_4cd8);
              std::__cxx11::string::string(local_1a90,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_1a90);
              local_4cb8.line = 0x562;
              lest::location::location(&local_2260,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"7 > e1",&local_4d62);
              std::__cxx11::string::string((string *)local_3750,local_4cf8);
              std::__cxx11::string::string((string *)&local_1ab0,(string *)&score.decomposition);
              lest::failure::failure((failure *)&local_4c78,&local_2260,local_3750,&local_1ab0);
              lest::failure::failure(pfVar4,(failure *)&local_4c78);
              __cxa_throw(pfVar4,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,&local_4d62);
              std::__cxx11::string::string(local_3770,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_3770);
              local_4cb8.line = 0x562;
              lest::location::location(local_45a8,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"7 > e1",&local_4d61);
              std::__cxx11::string::string((string *)&local_4bb0,local_4cf8);
              std::__cxx11::string::string((string *)&local_3790,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)&local_4c78,local_45a8,&local_4bb0,&local_3790,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_4cd8,lest_env);
              std::__cxx11::string::string((string *)&local_570,(string *)&local_4cd8);
              lest::report(poVar1,&local_4c78,&local_570);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              lest::message::~message(&local_4c78);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
            }
            std::__cxx11::string::_M_dispose();
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar5 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<int,_int,_int>::id1379 = iVar6 + -1;
        iVar6 = iVar6 + 1;
      }
      if (relop<int,_int,_int>::id1379 == iVar3) {
        uVar5 = 1;
        uVar2 = 0;
        while (uVar2 < uVar5) {
          std::__cxx11::string::string
                    ((string *)&local_4c78,"engaged   >= value",(allocator *)&score);
          std::__cxx11::string::string((string *)local_1af0,(string *)&local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,local_1af0);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          while (bVar7 = lest__ctx_section.once != false, lest__ctx_section.once = false, bVar7) {
            local_4cb8.file._M_dataplus._M_p = &e2.has_value_;
            local_4d18[0]._0_4_ = 6;
            lest::expression_lhs<nonstd::optional_lite::optional<int>const&>::operator>=
                      ((result *)&local_4c78,
                       (expression_lhs<nonstd::optional_lite::optional<int>const&> *)&local_4cb8,
                       (int *)local_4d18);
            lest::result::result(&score,(result *)&local_4c78);
            std::__cxx11::string::_M_dispose();
            if (score.passed == false) {
              pfVar4 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,(allocator *)&local_4cd8);
              std::__cxx11::string::string(local_1b10,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_1b10);
              local_4cb8.line = 0x563;
              lest::location::location(&local_2288,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"e2 >= 6",&local_4d62);
              std::__cxx11::string::string((string *)local_37d0,local_4cf8);
              std::__cxx11::string::string((string *)&local_1b30,(string *)&score.decomposition);
              lest::failure::failure((failure *)&local_4c78,&local_2288,local_37d0,&local_1b30);
              lest::failure::failure(pfVar4,(failure *)&local_4c78);
              __cxa_throw(pfVar4,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,&local_4d62);
              std::__cxx11::string::string(local_37f0,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_37f0);
              local_4cb8.line = 0x563;
              lest::location::location(local_45f8,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"e2 >= 6",&local_4d61);
              std::__cxx11::string::string((string *)&local_4bd0,local_4cf8);
              std::__cxx11::string::string((string *)&local_3810,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)&local_4c78,local_45f8,&local_4bd0,&local_3810,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_4cd8,lest_env);
              std::__cxx11::string::string((string *)&local_590,(string *)&local_4cd8);
              lest::report(poVar1,&local_4c78,&local_590);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              lest::message::~message(&local_4c78);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
            }
            std::__cxx11::string::_M_dispose();
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar5 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<int,_int,_int>::id1380 = iVar6 + -1;
        iVar6 = iVar6 + 1;
      }
      if (relop<int,_int,_int>::id1380 == iVar3) {
        uVar5 = 1;
        uVar2 = 0;
        while (uVar2 < uVar5) {
          std::__cxx11::string::string
                    ((string *)&local_4c78,"value     >= engaged",(allocator *)&score);
          std::__cxx11::string::string((string *)local_1b70,(string *)&local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,local_1b70);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          while (bVar7 = lest__ctx_section.once != false, lest__ctx_section.once = false, bVar7) {
            local_4d18[0]._0_4_ = 7;
            local_4cb8.file._M_dataplus._M_p = &local_4d18[0].has_value_;
            lest::expression_lhs<int_const&>::operator>=
                      ((result *)&local_4c78,(expression_lhs<int_const&> *)&local_4cb8,&e1);
            lest::result::result(&score,(result *)&local_4c78);
            std::__cxx11::string::_M_dispose();
            if (score.passed == false) {
              pfVar4 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,(allocator *)&local_4cd8);
              std::__cxx11::string::string(local_1b90,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_1b90);
              local_4cb8.line = 0x564;
              lest::location::location(&local_22b0,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"7 >= e1",&local_4d62);
              std::__cxx11::string::string((string *)local_3850,local_4cf8);
              std::__cxx11::string::string((string *)&local_1bb0,(string *)&score.decomposition);
              lest::failure::failure((failure *)&local_4c78,&local_22b0,local_3850,&local_1bb0);
              lest::failure::failure(pfVar4,(failure *)&local_4c78);
              __cxa_throw(pfVar4,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string
                        ((string *)local_4d18,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                         ,&local_4d62);
              std::__cxx11::string::string(local_3870,(string *)local_4d18);
              std::__cxx11::string::string((string *)&local_4cb8,local_3870);
              local_4cb8.line = 0x564;
              lest::location::location(local_4648,&local_4cb8);
              std::__cxx11::string::string(local_4cf8,"7 >= e1",&local_4d61);
              std::__cxx11::string::string((string *)&local_4bf0,local_4cf8);
              std::__cxx11::string::string((string *)&local_3890,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)&local_4c78,local_4648,&local_4bf0,&local_3890,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_4cd8,lest_env);
              std::__cxx11::string::string((string *)&local_5b0,(string *)&local_4cd8);
              lest::report(poVar1,&local_4c78,&local_5b0);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              lest::message::~message(&local_4c78);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
            }
            std::__cxx11::string::_M_dispose();
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar5 = 0;
          uVar2 = 1;
        }
      }
    }
    lest::ctx::~ctx(&lest__ctx_setup);
    bVar7 = iVar3 == 0;
    iVar3 = iVar3 + 1;
    iVar6 = iVar6 - (uint)bVar7;
  } while( true );
}

Assistant:

void relop( lest::env & lest_env )
{
    SETUP( "" ) {
        optional<R> d;
        optional<S> e1( 6 );
        optional<T> e2( 7 );

    SECTION( "engaged    == engaged"    ) { EXPECT(   e1 == e1  ); }
    SECTION( "engaged    == disengaged" ) { EXPECT( !(e1 == d ) ); }
    SECTION( "disengaged == engaged"    ) { EXPECT( !(d  == e1) ); }

    SECTION( "engaged    != engaged"    ) { EXPECT(   e1 != e2  ); }
    SECTION( "engaged    != disengaged" ) { EXPECT(   e1 != d   ); }
    SECTION( "disengaged != engaged"    ) { EXPECT(   d  != e2  ); }

    SECTION( "engaged    <  engaged"    ) { EXPECT(   e1 <  e2  ); }
    SECTION( "engaged    <  disengaged" ) { EXPECT( !(e1 <  d ) ); }
    SECTION( "disengaged <  engaged"    ) { EXPECT(   d  <  e2  ); }

    SECTION( "engaged    <= engaged"    ) { EXPECT(   e1 <= e1  ); }
    SECTION( "engaged    <= engaged"    ) { EXPECT(   e1 <= e2  ); }
    SECTION( "engaged    <= disengaged" ) { EXPECT( !(e1 <= d ) ); }
    SECTION( "disengaged <= engaged"    ) { EXPECT(   d  <= e2  ); }

    SECTION( "engaged    >  engaged"    ) { EXPECT(   e2 >  e1  ); }
    SECTION( "engaged    >  disengaged" ) { EXPECT(   e2 >  d   ); }
    SECTION( "disengaged >  engaged"    ) { EXPECT( !(d  >  e1) ); }

    SECTION( "engaged    >= engaged"    ) { EXPECT(   e1 >= e1  ); }
    SECTION( "engaged    >= engaged"    ) { EXPECT(   e2 >= e1  ); }
    SECTION( "engaged    >= disengaged" ) { EXPECT(   e2 >= d   ); }
    SECTION( "disengaged >= engaged"    ) { EXPECT( !(d  >= e1) ); }

    SECTION( "disengaged == nullopt"    ) { EXPECT(  (d       == nullopt) ); }
    SECTION( "nullopt    == disengaged" ) { EXPECT(  (nullopt == d      ) ); }
    SECTION( "engaged    == nullopt"    ) { EXPECT(  (e1      != nullopt) ); }
    SECTION( "nullopt    == engaged"    ) { EXPECT(  (nullopt != e1     ) ); }
    SECTION( "disengaged == nullopt"    ) { EXPECT( !(d       <  nullopt) ); }
    SECTION( "nullopt    == disengaged" ) { EXPECT( !(nullopt <  d      ) ); }
    SECTION( "disengaged == nullopt"    ) { EXPECT(  (d       <= nullopt) ); }
    SECTION( "nullopt    == disengaged" ) { EXPECT(  (nullopt <= d      ) ); }
    SECTION( "disengaged == nullopt"    ) { EXPECT( !(d       >  nullopt) ); }
    SECTION( "nullopt    == disengaged" ) { EXPECT( !(nullopt >  d      ) ); }
    SECTION( "disengaged == nullopt"    ) { EXPECT(  (d       >= nullopt) ); }
    SECTION( "nullopt    == disengaged" ) { EXPECT(  (nullopt >= d      ) ); }

    SECTION( "engaged    == value"      ) { EXPECT( e1 == 6  ); }
    SECTION( "value     == engaged"     ) { EXPECT(  6 == e1 ); }
    SECTION( "engaged   != value"       ) { EXPECT( e1 != 7  ); }
    SECTION( "value     != engaged"     ) { EXPECT(  6 != e2 ); }
    SECTION( "engaged   <  value"       ) { EXPECT( e1 <  7  ); }
    SECTION( "value     <  engaged"     ) { EXPECT(  6 <  e2 ); }
    SECTION( "engaged   <= value"       ) { EXPECT( e1 <= 7  ); }
    SECTION( "value     <= engaged"     ) { EXPECT(  6 <= e2 ); }
    SECTION( "engaged   >  value"       ) { EXPECT( e2 >  6  ); }
    SECTION( "value     >  engaged"     ) { EXPECT(  7 >  e1 ); }
    SECTION( "engaged   >= value"       ) { EXPECT( e2 >= 6  ); }
    SECTION( "value     >= engaged"     ) { EXPECT(  7 >= e1 ); }
    }
}